

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx512::forward
          (DeconvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int *piVar18;
  void *pvVar19;
  size_t sVar20;
  void *pvVar21;
  undefined4 *puVar22;
  uint *puVar23;
  float *pfVar24;
  Layer *pLVar25;
  byte bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  byte bVar35;
  byte bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  ulong uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [60];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  float afVar82 [16];
  float afVar83 [16];
  float afVar84 [16];
  float afVar85 [16];
  float afVar86 [16];
  float afVar87 [16];
  float afVar88 [16];
  float afVar89 [16];
  float afVar90 [16];
  float afVar91 [16];
  float afVar92 [16];
  float afVar93 [16];
  float afVar94 [16];
  float afVar95 [16];
  float afVar96 [16];
  float afVar97 [16];
  float afVar98 [16];
  Option OVar99;
  undefined1 auVar100 [36];
  Mat *pMVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  ulong uVar109;
  int _h;
  int iVar110;
  uint uVar111;
  ulong uVar112;
  int iVar113;
  undefined1 (*pauVar114) [16];
  undefined1 (*pauVar115) [64];
  undefined1 (*pauVar116) [32];
  int iVar117;
  void *pvVar118;
  ulong uVar119;
  size_t sVar120;
  long lVar121;
  ulong uVar122;
  ushort uVar123;
  ulong uVar124;
  ulong uVar125;
  uint uVar126;
  uint uVar162;
  uint uVar163;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [28];
  uint uVar165;
  uint uVar166;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  uint uVar164;
  uint uVar167;
  uint uVar168;
  undefined1 auVar161 [32];
  uint uVar169;
  uint uVar170;
  uint uVar171;
  uint uVar172;
  uint uVar173;
  uint uVar174;
  uint uVar175;
  uint uVar176;
  int iVar177;
  int iVar178;
  int iVar179;
  int iVar180;
  int iVar181;
  int iVar182;
  int iVar183;
  int iVar184;
  int iVar185;
  int iVar186;
  int iVar187;
  int iVar188;
  int iVar189;
  int iVar190;
  int iVar191;
  int _w;
  float fVar192;
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  float fVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  float __x;
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  v4sf one;
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 in_ZMM29 [64];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  int local_374;
  ulong local_358;
  float *local_350;
  ulong local_330;
  uint local_328;
  int local_318;
  void *local_2f0;
  Mat local_298;
  int local_248;
  int iStack_244;
  undefined8 uStack_240;
  undefined1 local_238 [24];
  int iStack_220;
  Allocator *pAStack_218;
  undefined8 uStack_210;
  int iStack_208;
  int iStack_204;
  int iStack_200;
  undefined1 auStack_21c [36];
  size_t local_1f8;
  Option *local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  Mat *local_1c0;
  Mat local_1b8;
  long local_168;
  void *local_160;
  long local_158;
  void *local_150;
  void *local_148;
  int *local_140;
  Allocator *local_138;
  int local_130;
  Allocator *local_128;
  int local_120;
  int iStack_11c;
  int iStack_118;
  int iStack_114;
  int local_110;
  ulong local_108;
  void *local_100;
  int *local_f8;
  ulong local_f0;
  int local_e8;
  Allocator *local_e0;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  undefined4 local_c8;
  ulong local_c0;
  undefined1 local_b8 [64];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  
  auVar127 = in_ZMM29._0_16_;
  uVar17 = bottom_blob->elemsize;
  iVar113 = bottom_blob->elempack;
  uVar111 = 1;
  if (opt->use_packing_layout == true) {
    uVar111 = (this->super_DeconvolutionDepthWise).num_output;
    if ((uVar111 & 0xf) == 0) {
      uVar111 = 0x10;
    }
    else if ((uVar111 & 7) == 0) {
      uVar111 = 8;
    }
    else {
      uVar111 = (uint)((uVar111 & 3) == 0) * 3 + 1;
    }
  }
  uVar3 = bottom_blob->w;
  uVar8 = bottom_blob->h;
  auVar131._4_4_ = uVar8;
  auVar131._0_4_ = uVar3;
  uVar4 = (this->super_DeconvolutionDepthWise).kernel_w;
  uVar9 = (this->super_DeconvolutionDepthWise).kernel_h;
  auVar130._4_4_ = uVar9;
  auVar130._0_4_ = uVar4;
  uVar5 = (this->super_DeconvolutionDepthWise).dilation_w;
  uVar10 = (this->super_DeconvolutionDepthWise).dilation_h;
  auVar132._4_4_ = uVar10;
  auVar132._0_4_ = uVar5;
  uVar6 = (this->super_DeconvolutionDepthWise).stride_w;
  uVar11 = (this->super_DeconvolutionDepthWise).stride_h;
  auVar133._4_4_ = uVar11;
  auVar133._0_4_ = uVar6;
  uVar15 = bottom_blob->c;
  uVar109 = (ulong)uVar15;
  uVar7 = (this->super_DeconvolutionDepthWise).output_pad_right;
  uVar12 = (this->super_DeconvolutionDepthWise).output_pad_bottom;
  auVar134._4_4_ = uVar12;
  auVar134._0_4_ = uVar7;
  local_298.cstep = 0;
  auVar129 = (undefined1  [16])0x0;
  local_298.data = (void *)0x0;
  local_298.refcount._0_4_ = 0;
  local_298.refcount._4_4_ = 0;
  local_298.elemsize = 0;
  local_298.elempack = 0;
  local_298.allocator = (Allocator *)0x0;
  local_298.dims = 0;
  local_298.w = 0;
  local_298.h = 0;
  local_298.d = 0;
  local_298.c = 0;
  auVar128._0_4_ = (this->super_DeconvolutionDepthWise).pad_left;
  auVar128._4_4_ = (this->super_DeconvolutionDepthWise).pad_right;
  auVar128._8_4_ = (this->super_DeconvolutionDepthWise).pad_top;
  auVar128._12_4_ = (this->super_DeconvolutionDepthWise).pad_bottom;
  uVar122 = vpcmpd_avx512vl((undefined1  [16])0x0,auVar128,1);
  lVar121 = 0x10;
  uStack_240 = 0;
  if (((uVar122 & 0xf) == 0) &&
     ((((this->super_DeconvolutionDepthWise).output_w < 1 ||
       ((this->super_DeconvolutionDepthWise).output_h < 1)) && (lVar121 = 8, &local_298 != top_blob)
      ))) {
    piVar18 = top_blob->refcount;
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + 1;
      UNLOCK();
    }
    local_298.data = top_blob->data;
    local_298.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_298.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_298.elemsize = top_blob->elemsize;
    local_298.elempack = top_blob->elempack;
    local_298.allocator = top_blob->allocator;
    auVar129._0_4_ = top_blob->dims;
    auVar129._4_4_ = top_blob->w;
    uVar13 = top_blob->h;
    uVar14 = top_blob->d;
    auVar129._8_8_ = CONCAT44(uVar14,uVar13);
    local_298.c = top_blob->c;
    local_298.cstep = top_blob->cstep;
    local_298.dims = auVar129._0_4_;
    local_298.w = auVar129._4_4_;
    local_298._48_8_ = auVar129._8_8_;
  }
  auVar131._8_8_ = 0;
  auVar133._8_8_ = 0;
  auVar134._8_8_ = 0;
  auVar132._8_8_ = 0;
  auVar130._8_8_ = 0;
  auVar129 = vpcmpeqd_avx(auVar129,auVar129);
  auVar128 = vpaddd_avx(auVar130,auVar129);
  local_1e8 = vpmulld_avx(auVar128,auVar132);
  auVar128 = vpaddd_avx(auVar131,auVar129);
  auVar128 = vpmulld_avx(auVar133,auVar128);
  auVar128 = vpaddd_avx(local_1e8,auVar128);
  auVar128 = vpaddd_avx(auVar128,auVar134);
  local_1d8 = vpsubd_avx(auVar128,auVar129);
  sVar120 = (uVar17 / (ulong)(long)iVar113) * (ulong)uVar111;
  _w = local_1d8._0_4_;
  _h = local_1d8._4_4_;
  local_248 = uVar3;
  iStack_244 = uVar8;
  Mat::create(&local_298,_w,_h,(this->super_DeconvolutionDepthWise).num_output / (int)uVar111,
              sVar120,uVar111,*(Allocator **)(&opt->lightmode + lVar121));
  iVar106 = iStack_244;
  afVar98 = _ps512_cephes_log_p8;
  afVar97 = _ps512_cephes_log_p7;
  afVar96 = _ps512_cephes_log_p6;
  afVar95 = _ps512_cephes_log_p5;
  afVar94 = _ps512_cephes_log_p4;
  afVar93 = _ps512_cephes_log_p3;
  afVar92 = _ps512_cephes_log_p2;
  afVar91 = ::_ps512_cephes_exp_p5;
  afVar90 = ::_ps512_cephes_exp_p4;
  afVar89 = ::_ps512_cephes_exp_p3;
  afVar88 = ::_ps512_cephes_exp_p2;
  afVar87 = ::_ps512_cephes_exp_p1;
  afVar86 = ::_ps512_cephes_exp_p0;
  afVar85 = ::_ps512_cephes_LOG2EF;
  afVar84 = ::_ps512_exp_lo;
  afVar83 = ::_ps512_exp_hi;
  afVar82 = ::_ps512_1;
  iVar102 = -100;
  if ((local_298.data == (void *)0x0) || ((long)local_298.c * local_298.cstep == 0))
  goto LAB_00434cc9;
  iVar102 = (this->super_DeconvolutionDepthWise).num_output;
  iVar110 = (this->super_DeconvolutionDepthWise).group;
  local_1f0 = opt;
  local_1c0 = top_blob;
  if (iVar110 == iVar102 && iVar113 * uVar15 == iVar110) {
    iVar102 = (this->super_DeconvolutionDepthWise).kernel_h *
              (this->super_DeconvolutionDepthWise).kernel_w;
    uVar1 = local_1e8._4_4_;
    if (iVar113 < 8) {
      if (iVar113 == 1) {
        if (0 < (int)uVar15) {
          auVar127._4_4_ = iStack_244;
          auVar127._0_4_ = local_248;
          auVar127._8_8_ = uStack_240;
          local_150 = local_298.data;
          local_158 = local_298.cstep * local_298.elemsize;
          local_2f0 = (this->weight_data_tm).data;
          iVar113 = bottom_blob->w;
          local_160 = bottom_blob->data;
          sVar120 = bottom_blob->elemsize;
          local_168 = bottom_blob->cstep * sVar120;
          auVar247 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar17 = vpcmpd_avx512vl(ZEXT816(0) << 0x40,local_1d8,1);
          local_1d8._0_4_ = (int)(uVar17 & 0xf);
          auVar195 = vpbroadcastd_avx512f(auVar127);
          local_1e8._0_8_ = (long)iVar102 << 2;
          local_330 = 0;
          auVar196 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar254 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar257 = vpmovsxbd_avx512f(_DAT_005a9784);
          auVar258 = vpternlogd_avx512f(in_ZMM16,in_ZMM16,in_ZMM16,0xff);
          auVar259 = vpbroadcastq_avx512f(ZEXT816(0x10));
          auVar260 = vpbroadcastd_avx512f(ZEXT416(0x10));
          local_b8 = vmovdqu64_avx512f(auVar195);
          do {
            pvVar19 = local_160;
            if (((uVar17 & 0xf) >> 1 & 1) != 0) {
              lVar121 = local_168 * local_330;
              local_350 = (float *)(local_158 * local_330 + (long)local_150);
              uVar111 = (this->super_DeconvolutionDepthWise).kernel_h;
              iVar102 = (this->super_DeconvolutionDepthWise).bias_term;
              iVar110 = (this->super_DeconvolutionDepthWise).activation_type;
              local_248 = 0;
              do {
                if ((local_1d8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  pvVar21 = (this->super_DeconvolutionDepthWise).bias_data.data;
                  iVar16 = (this->super_DeconvolutionDepthWise).dilation_h;
                  iVar108 = local_248 - uVar1;
                  pfVar24 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                  iVar117 = 0;
                  do {
                    if (iVar102 == 0) {
                      auVar205 = ZEXT1664((undefined1  [16])0x0);
                    }
                    else {
                      auVar205 = ZEXT464(*(uint *)((long)pvVar21 + local_330 * 4));
                    }
                    auVar127 = auVar205._0_16_;
                    if (0 < (int)uVar111) {
                      iVar103 = (this->super_DeconvolutionDepthWise).stride_h;
                      uVar15 = (this->super_DeconvolutionDepthWise).kernel_w;
                      iVar104 = (this->super_DeconvolutionDepthWise).stride_w;
                      uVar122 = (ulong)(uVar15 + 0xf & 0xfffffff0);
                      auVar202 = vpbroadcastq_avx512f();
                      auVar75 = vpbroadcastd_avx512f
                                          (ZEXT416((uint)(this->super_DeconvolutionDepthWise).
                                                         dilation_w));
                      auVar76 = vpbroadcastd_avx512f();
                      uVar112 = 0;
                      pvVar118 = local_2f0;
                      do {
                        iVar105 = iVar16 * (int)uVar112 + iVar108;
                        if (((-1 < iVar105) &&
                            (iVar107 = iVar105 / iVar103,
                            iVar107 < iVar106 && iVar105 % iVar103 == 0)) && (0 < (int)uVar15)) {
                          auVar214 = ZEXT1664(CONCAT124(auVar247._4_12_,auVar205._0_4_));
                          uVar119 = 0;
                          auVar205 = vmovdqa64_avx512f(auVar254);
                          auVar208 = vmovdqa64_avx512f(auVar196);
                          auVar211 = vmovdqa64_avx512f(auVar257);
                          do {
                            uVar45 = vpcmpuq_avx512f(auVar205,auVar202,2);
                            uVar46 = vpcmpuq_avx512f(auVar208,auVar202,2);
                            bVar35 = (byte)uVar46;
                            uVar123 = CONCAT11(bVar35,(byte)uVar45);
                            auVar77 = vpmulld_avx512f(auVar75,auVar211);
                            auVar77 = vpaddd_avx512f(auVar76,auVar77);
                            uVar124 = vpcmpgtd_avx512f(auVar77,auVar258);
                            uVar124 = uVar123 & uVar124;
                            if ((uVar124 & 1) != 0) {
                              in_ZMM8 = ZEXT464((uint)(auVar77._0_4_ % iVar104));
                            }
                            if ((uVar124 & 2) != 0) {
                              auVar127 = vpinsrd_avx(in_ZMM8._0_16_,auVar77._4_4_ % iVar104,1);
                              in_ZMM8 = vinserti32x4_avx512f(in_ZMM8,auVar127,0);
                            }
                            if ((uVar124 & 4) != 0) {
                              auVar127 = vpinsrd_avx(in_ZMM8._0_16_,auVar77._8_4_ % iVar104,2);
                              in_ZMM8 = vinserti32x4_avx512f(in_ZMM8,auVar127,0);
                            }
                            if ((uVar124 & 8) != 0) {
                              auVar127 = vpinsrd_avx(in_ZMM8._0_16_,auVar77._12_4_ % iVar104,3);
                              in_ZMM8 = vinserti32x4_avx512f(in_ZMM8,auVar127,0);
                            }
                            auVar217 = in_ZMM8;
                            if ((uVar124 & 0x10) != 0) {
                              auVar78 = vpbroadcastd_avx512f();
                              auVar217._16_4_ = auVar78._16_4_;
                              auVar217._0_16_ = in_ZMM8._0_16_;
                              auVar217._20_4_ = in_ZMM8._20_4_;
                              auVar217._24_4_ = in_ZMM8._24_4_;
                              auVar217._28_4_ = in_ZMM8._28_4_;
                              auVar217._32_4_ = in_ZMM8._32_4_;
                              auVar217._36_4_ = in_ZMM8._36_4_;
                              auVar217._40_4_ = in_ZMM8._40_4_;
                              auVar217._44_4_ = in_ZMM8._44_4_;
                              auVar217._48_4_ = in_ZMM8._48_4_;
                              auVar217._52_4_ = in_ZMM8._52_4_;
                              auVar217._56_4_ = in_ZMM8._56_4_;
                              auVar217._60_4_ = in_ZMM8._60_4_;
                            }
                            auVar218 = auVar217;
                            if ((uVar124 & 0x20) != 0) {
                              auVar78 = vpbroadcastd_avx512f();
                              auVar218._20_4_ = auVar78._20_4_;
                              auVar218._0_20_ = auVar217._0_20_;
                              auVar218._24_4_ = auVar217._24_4_;
                              auVar218._28_4_ = auVar217._28_4_;
                              auVar218._32_4_ = auVar217._32_4_;
                              auVar218._36_4_ = auVar217._36_4_;
                              auVar218._40_4_ = auVar217._40_4_;
                              auVar218._44_4_ = auVar217._44_4_;
                              auVar218._48_4_ = auVar217._48_4_;
                              auVar218._52_4_ = auVar217._52_4_;
                              auVar218._56_4_ = auVar217._56_4_;
                              auVar218._60_4_ = auVar217._60_4_;
                            }
                            auVar219 = auVar218;
                            if ((uVar124 & 0x40) != 0) {
                              auVar78 = vpbroadcastd_avx512f();
                              auVar219._24_4_ = auVar78._24_4_;
                              auVar219._0_24_ = auVar218._0_24_;
                              auVar219._28_4_ = auVar218._28_4_;
                              auVar219._32_4_ = auVar218._32_4_;
                              auVar219._36_4_ = auVar218._36_4_;
                              auVar219._40_4_ = auVar218._40_4_;
                              auVar219._44_4_ = auVar218._44_4_;
                              auVar219._48_4_ = auVar218._48_4_;
                              auVar219._52_4_ = auVar218._52_4_;
                              auVar219._56_4_ = auVar218._56_4_;
                              auVar219._60_4_ = auVar218._60_4_;
                            }
                            auVar220 = auVar219;
                            if ((uVar124 & 0x80) != 0) {
                              auVar78 = vpbroadcastd_avx512f();
                              auVar220._28_4_ = auVar78._28_4_;
                              auVar220._0_28_ = auVar219._0_28_;
                              auVar220._32_4_ = auVar219._32_4_;
                              auVar220._36_4_ = auVar219._36_4_;
                              auVar220._40_4_ = auVar219._40_4_;
                              auVar220._44_4_ = auVar219._44_4_;
                              auVar220._48_4_ = auVar219._48_4_;
                              auVar220._52_4_ = auVar219._52_4_;
                              auVar220._56_4_ = auVar219._56_4_;
                              auVar220._60_4_ = auVar219._60_4_;
                            }
                            auVar221 = auVar220;
                            if ((uVar124 & 0x100) != 0) {
                              vextracti32x4_avx512f(auVar77,2);
                              auVar78 = vpbroadcastd_avx512f();
                              auVar221._32_4_ = auVar78._32_4_;
                              auVar221._0_32_ = auVar220._0_32_;
                              auVar221._36_4_ = auVar220._36_4_;
                              auVar221._40_4_ = auVar220._40_4_;
                              auVar221._44_4_ = auVar220._44_4_;
                              auVar221._48_4_ = auVar220._48_4_;
                              auVar221._52_4_ = auVar220._52_4_;
                              auVar221._56_4_ = auVar220._56_4_;
                              auVar221._60_4_ = auVar220._60_4_;
                            }
                            auVar222 = auVar221;
                            if ((uVar124 & 0x200) != 0) {
                              vextracti32x4_avx512f(auVar77,2);
                              auVar78 = vpbroadcastd_avx512f();
                              auVar222._36_4_ = auVar78._36_4_;
                              auVar222._0_36_ = auVar221._0_36_;
                              auVar222._40_4_ = auVar221._40_4_;
                              auVar222._44_4_ = auVar221._44_4_;
                              auVar222._48_4_ = auVar221._48_4_;
                              auVar222._52_4_ = auVar221._52_4_;
                              auVar222._56_4_ = auVar221._56_4_;
                              auVar222._60_4_ = auVar221._60_4_;
                            }
                            auVar223 = auVar222;
                            if ((uVar124 & 0x400) != 0) {
                              vextracti32x4_avx512f(auVar77,2);
                              auVar78 = vpbroadcastd_avx512f();
                              auVar223._40_4_ = auVar78._40_4_;
                              auVar223._0_40_ = auVar222._0_40_;
                              auVar223._44_4_ = auVar222._44_4_;
                              auVar223._48_4_ = auVar222._48_4_;
                              auVar223._52_4_ = auVar222._52_4_;
                              auVar223._56_4_ = auVar222._56_4_;
                              auVar223._60_4_ = auVar222._60_4_;
                            }
                            auVar224 = auVar223;
                            if ((uVar124 & 0x800) != 0) {
                              vextracti32x4_avx512f(auVar77,2);
                              auVar78 = vpbroadcastd_avx512f();
                              auVar224._44_4_ = auVar78._44_4_;
                              auVar224._0_44_ = auVar223._0_44_;
                              auVar224._48_4_ = auVar223._48_4_;
                              auVar224._52_4_ = auVar223._52_4_;
                              auVar224._56_4_ = auVar223._56_4_;
                              auVar224._60_4_ = auVar223._60_4_;
                            }
                            auVar225 = auVar224;
                            if ((uVar124 & 0x1000) != 0) {
                              vextracti32x4_avx512f(auVar77,3);
                              auVar78 = vpbroadcastd_avx512f();
                              auVar225._48_4_ = auVar78._48_4_;
                              auVar225._0_48_ = auVar224._0_48_;
                              auVar225._52_4_ = auVar224._52_4_;
                              auVar225._56_4_ = auVar224._56_4_;
                              auVar225._60_4_ = auVar224._60_4_;
                            }
                            auVar226 = auVar225;
                            if ((uVar124 & 0x2000) != 0) {
                              vextracti32x4_avx512f(auVar77,3);
                              auVar78 = vpbroadcastd_avx512f();
                              auVar226._52_4_ = auVar78._52_4_;
                              auVar226._0_52_ = auVar225._0_52_;
                              auVar226._56_4_ = auVar225._56_4_;
                              auVar226._60_4_ = auVar225._60_4_;
                            }
                            auVar227 = auVar226;
                            if ((uVar124 & 0x4000) != 0) {
                              vextracti32x4_avx512f(auVar77,3);
                              auVar78 = vpbroadcastd_avx512f();
                              auVar227._56_4_ = auVar78._56_4_;
                              auVar227._0_56_ = auVar226._0_56_;
                              auVar227._60_4_ = auVar226._60_4_;
                            }
                            if ((uVar124 & 0x8000) != 0) {
                              vextracti32x4_avx512f(auVar77,3);
                              auVar78 = vpbroadcastd_avx512f();
                              auVar72 = auVar227._0_60_;
                              auVar227._60_4_ = auVar78._60_4_;
                              auVar227._0_60_ = auVar72;
                            }
                            uVar125 = vptestnmd_avx512f(auVar227,auVar227);
                            uVar124 = uVar124 & uVar125;
                            if ((uVar124 & 1) != 0) {
                              auVar227 = ZEXT464((uint)(auVar77._0_4_ / iVar104));
                            }
                            if ((uVar124 & 2) != 0) {
                              auVar127 = vpinsrd_avx(auVar227._0_16_,auVar77._4_4_ / iVar104,1);
                              auVar227 = vinserti32x4_avx512f(auVar227,auVar127,0);
                            }
                            if ((uVar124 & 4) != 0) {
                              auVar127 = vpinsrd_avx(auVar227._0_16_,auVar77._8_4_ / iVar104,2);
                              auVar227 = vinserti32x4_avx512f(auVar227,auVar127,0);
                            }
                            if ((uVar124 & 8) != 0) {
                              auVar127 = vpinsrd_avx(auVar227._0_16_,auVar77._12_4_ / iVar104,3);
                              auVar227 = vinserti32x4_avx512f(auVar227,auVar127,0);
                            }
                            auVar228 = auVar227;
                            if ((uVar124 & 0x10) != 0) {
                              auVar78 = vpbroadcastd_avx512f();
                              auVar228._16_4_ = auVar78._16_4_;
                              auVar228._0_16_ = auVar227._0_16_;
                              auVar228._20_4_ = auVar227._20_4_;
                              auVar228._24_4_ = auVar227._24_4_;
                              auVar228._28_4_ = auVar227._28_4_;
                              auVar228._32_4_ = auVar227._32_4_;
                              auVar228._36_4_ = auVar227._36_4_;
                              auVar228._40_4_ = auVar227._40_4_;
                              auVar228._44_4_ = auVar227._44_4_;
                              auVar228._48_4_ = auVar227._48_4_;
                              auVar228._52_4_ = auVar227._52_4_;
                              auVar228._56_4_ = auVar227._56_4_;
                              auVar228._60_4_ = auVar227._60_4_;
                            }
                            auVar229 = auVar228;
                            if ((uVar124 & 0x20) != 0) {
                              auVar78 = vpbroadcastd_avx512f();
                              auVar229._20_4_ = auVar78._20_4_;
                              auVar229._0_20_ = auVar228._0_20_;
                              auVar229._24_4_ = auVar228._24_4_;
                              auVar229._28_4_ = auVar228._28_4_;
                              auVar229._32_4_ = auVar228._32_4_;
                              auVar229._36_4_ = auVar228._36_4_;
                              auVar229._40_4_ = auVar228._40_4_;
                              auVar229._44_4_ = auVar228._44_4_;
                              auVar229._48_4_ = auVar228._48_4_;
                              auVar229._52_4_ = auVar228._52_4_;
                              auVar229._56_4_ = auVar228._56_4_;
                              auVar229._60_4_ = auVar228._60_4_;
                            }
                            auVar230 = auVar229;
                            if ((uVar124 & 0x40) != 0) {
                              auVar78 = vpbroadcastd_avx512f();
                              auVar230._24_4_ = auVar78._24_4_;
                              auVar230._0_24_ = auVar229._0_24_;
                              auVar230._28_4_ = auVar229._28_4_;
                              auVar230._32_4_ = auVar229._32_4_;
                              auVar230._36_4_ = auVar229._36_4_;
                              auVar230._40_4_ = auVar229._40_4_;
                              auVar230._44_4_ = auVar229._44_4_;
                              auVar230._48_4_ = auVar229._48_4_;
                              auVar230._52_4_ = auVar229._52_4_;
                              auVar230._56_4_ = auVar229._56_4_;
                              auVar230._60_4_ = auVar229._60_4_;
                            }
                            auVar231 = auVar230;
                            if ((uVar124 & 0x80) != 0) {
                              auVar78 = vpbroadcastd_avx512f();
                              auVar231._28_4_ = auVar78._28_4_;
                              auVar231._0_28_ = auVar230._0_28_;
                              auVar231._32_4_ = auVar230._32_4_;
                              auVar231._36_4_ = auVar230._36_4_;
                              auVar231._40_4_ = auVar230._40_4_;
                              auVar231._44_4_ = auVar230._44_4_;
                              auVar231._48_4_ = auVar230._48_4_;
                              auVar231._52_4_ = auVar230._52_4_;
                              auVar231._56_4_ = auVar230._56_4_;
                              auVar231._60_4_ = auVar230._60_4_;
                            }
                            auVar232 = auVar231;
                            if ((uVar124 & 0x100) != 0) {
                              vextracti32x4_avx512f(auVar77,2);
                              auVar78 = vpbroadcastd_avx512f();
                              auVar232._32_4_ = auVar78._32_4_;
                              auVar232._0_32_ = auVar231._0_32_;
                              auVar232._36_4_ = auVar231._36_4_;
                              auVar232._40_4_ = auVar231._40_4_;
                              auVar232._44_4_ = auVar231._44_4_;
                              auVar232._48_4_ = auVar231._48_4_;
                              auVar232._52_4_ = auVar231._52_4_;
                              auVar232._56_4_ = auVar231._56_4_;
                              auVar232._60_4_ = auVar231._60_4_;
                            }
                            auVar233 = auVar232;
                            if ((uVar124 & 0x200) != 0) {
                              vextracti32x4_avx512f(auVar77,2);
                              auVar78 = vpbroadcastd_avx512f();
                              auVar233._36_4_ = auVar78._36_4_;
                              auVar233._0_36_ = auVar232._0_36_;
                              auVar233._40_4_ = auVar232._40_4_;
                              auVar233._44_4_ = auVar232._44_4_;
                              auVar233._48_4_ = auVar232._48_4_;
                              auVar233._52_4_ = auVar232._52_4_;
                              auVar233._56_4_ = auVar232._56_4_;
                              auVar233._60_4_ = auVar232._60_4_;
                            }
                            auVar234 = auVar233;
                            if ((uVar124 & 0x400) != 0) {
                              vextracti32x4_avx512f(auVar77,2);
                              auVar78 = vpbroadcastd_avx512f();
                              auVar234._40_4_ = auVar78._40_4_;
                              auVar234._0_40_ = auVar233._0_40_;
                              auVar234._44_4_ = auVar233._44_4_;
                              auVar234._48_4_ = auVar233._48_4_;
                              auVar234._52_4_ = auVar233._52_4_;
                              auVar234._56_4_ = auVar233._56_4_;
                              auVar234._60_4_ = auVar233._60_4_;
                            }
                            auVar235 = auVar234;
                            if ((uVar124 & 0x800) != 0) {
                              vextracti32x4_avx512f(auVar77,2);
                              auVar78 = vpbroadcastd_avx512f();
                              auVar235._44_4_ = auVar78._44_4_;
                              auVar235._0_44_ = auVar234._0_44_;
                              auVar235._48_4_ = auVar234._48_4_;
                              auVar235._52_4_ = auVar234._52_4_;
                              auVar235._56_4_ = auVar234._56_4_;
                              auVar235._60_4_ = auVar234._60_4_;
                            }
                            auVar236 = auVar235;
                            if ((uVar124 & 0x1000) != 0) {
                              vextracti32x4_avx512f(auVar77,3);
                              auVar78 = vpbroadcastd_avx512f();
                              auVar236._48_4_ = auVar78._48_4_;
                              auVar236._0_48_ = auVar235._0_48_;
                              auVar236._52_4_ = auVar235._52_4_;
                              auVar236._56_4_ = auVar235._56_4_;
                              auVar236._60_4_ = auVar235._60_4_;
                            }
                            auVar237 = auVar236;
                            if ((uVar124 & 0x2000) != 0) {
                              vextracti32x4_avx512f(auVar77,3);
                              auVar78 = vpbroadcastd_avx512f();
                              auVar237._52_4_ = auVar78._52_4_;
                              auVar237._0_52_ = auVar236._0_52_;
                              auVar237._56_4_ = auVar236._56_4_;
                              auVar237._60_4_ = auVar236._60_4_;
                            }
                            in_ZMM8 = auVar237;
                            if ((uVar124 & 0x4000) != 0) {
                              vextracti32x4_avx512f(auVar77,3);
                              auVar78 = vpbroadcastd_avx512f();
                              in_ZMM8._56_4_ = auVar78._56_4_;
                              in_ZMM8._0_56_ = auVar237._0_56_;
                              in_ZMM8._60_4_ = auVar237._60_4_;
                            }
                            if ((uVar124 & 0x8000) != 0) {
                              vextracti32x4_avx512f(auVar77,3);
                              auVar77 = vpbroadcastd_avx512f();
                              auVar72 = in_ZMM8._0_60_;
                              in_ZMM8._60_4_ = auVar77._60_4_;
                              in_ZMM8._0_60_ = auVar72;
                            }
                            uVar125 = vpcmpgtd_avx512f(auVar195,in_ZMM8);
                            uVar125 = uVar124 & uVar125;
                            auVar77 = vgatherdps_avx512f(*(undefined4 *)
                                                          ((long)pvVar19 +
                                                          uVar122 * 4 +
                                                          (long)iVar107 * (long)iVar113 * sVar120 +
                                                          lVar121));
                            bVar26 = (byte)uVar125;
                            auVar79._4_4_ = (uint)((byte)(uVar125 >> 1) & 1) * auVar77._4_4_;
                            auVar79._0_4_ = (uint)(bVar26 & 1) * auVar77._0_4_;
                            auVar79._8_4_ = (uint)((byte)(uVar125 >> 2) & 1) * auVar77._8_4_;
                            auVar79._12_4_ = (uint)((byte)(uVar125 >> 3) & 1) * auVar77._12_4_;
                            auVar79._16_4_ = (uint)((byte)(uVar125 >> 4) & 1) * auVar77._16_4_;
                            auVar79._20_4_ = (uint)((byte)(uVar125 >> 5) & 1) * auVar77._20_4_;
                            auVar79._24_4_ = (uint)((byte)(uVar125 >> 6) & 1) * auVar77._24_4_;
                            auVar79._28_4_ = (uint)((byte)(uVar125 >> 7) & 1) * auVar77._28_4_;
                            bVar36 = (byte)(uVar125 >> 8);
                            auVar79._32_4_ = (uint)(bVar36 & 1) * auVar77._32_4_;
                            auVar79._36_4_ = (uint)((byte)(uVar125 >> 9) & 1) * auVar77._36_4_;
                            auVar79._40_4_ = (uint)((byte)(uVar125 >> 10) & 1) * auVar77._40_4_;
                            auVar79._44_4_ = (uint)((byte)(uVar125 >> 0xb) & 1) * auVar77._44_4_;
                            auVar79._48_4_ = (uint)((byte)(uVar125 >> 0xc) & 1) * auVar77._48_4_;
                            auVar79._52_4_ = (uint)((byte)(uVar125 >> 0xd) & 1) * auVar77._52_4_;
                            auVar79._56_4_ = (uint)((byte)(uVar125 >> 0xe) & 1) * auVar77._56_4_;
                            auVar79._60_4_ = (uint)(byte)(uVar125 >> 0xf) * auVar77._60_4_;
                            piVar18 = (int *)((long)pvVar118 + uVar119 * 4);
                            auVar80._4_4_ = (uint)((byte)(uVar125 >> 1) & 1) * piVar18[1];
                            auVar80._0_4_ = (uint)(bVar26 & 1) * *piVar18;
                            auVar80._8_4_ = (uint)((byte)(uVar125 >> 2) & 1) * piVar18[2];
                            auVar80._12_4_ = (uint)((byte)(uVar125 >> 3) & 1) * piVar18[3];
                            auVar80._16_4_ = (uint)((byte)(uVar125 >> 4) & 1) * piVar18[4];
                            auVar80._20_4_ = (uint)((byte)(uVar125 >> 5) & 1) * piVar18[5];
                            auVar80._24_4_ = (uint)((byte)(uVar125 >> 6) & 1) * piVar18[6];
                            auVar80._28_4_ = (uint)((byte)(uVar125 >> 7) & 1) * piVar18[7];
                            auVar80._32_4_ = (uint)(bVar36 & 1) * piVar18[8];
                            auVar80._36_4_ = (uint)((byte)(uVar125 >> 9) & 1) * piVar18[9];
                            auVar80._40_4_ = (uint)((byte)(uVar125 >> 10) & 1) * piVar18[10];
                            auVar80._44_4_ = (uint)((byte)(uVar125 >> 0xb) & 1) * piVar18[0xb];
                            auVar80._48_4_ = (uint)((byte)(uVar125 >> 0xc) & 1) * piVar18[0xc];
                            auVar80._52_4_ = (uint)((byte)(uVar125 >> 0xd) & 1) * piVar18[0xd];
                            auVar80._56_4_ = (uint)((byte)(uVar125 >> 0xe) & 1) * piVar18[0xe];
                            auVar80._60_4_ = (uint)(byte)(uVar125 >> 0xf) * piVar18[0xf];
                            uVar44 = vpcmpd_avx512f(in_ZMM8,auVar195,5);
                            uVar124 = uVar124 & uVar44;
                            auVar77 = vfmadd231ps_avx512f(auVar214,auVar80,auVar79);
                            iVar105 = auVar214._0_4_;
                            bVar28 = (bool)((byte)(uVar125 >> 1) & 1);
                            iVar177 = auVar214._4_4_;
                            bVar29 = (bool)((byte)(uVar125 >> 2) & 1);
                            iVar178 = auVar214._8_4_;
                            bVar30 = (bool)((byte)(uVar125 >> 3) & 1);
                            iVar179 = auVar214._12_4_;
                            bVar31 = (bool)((byte)(uVar125 >> 4) & 1);
                            iVar180 = auVar214._16_4_;
                            bVar32 = (bool)((byte)(uVar125 >> 5) & 1);
                            iVar181 = auVar214._20_4_;
                            bVar33 = (bool)((byte)(uVar125 >> 6) & 1);
                            iVar182 = auVar214._24_4_;
                            bVar34 = (bool)((byte)(uVar125 >> 7) & 1);
                            iVar183 = auVar214._28_4_;
                            iVar184 = auVar214._32_4_;
                            bVar37 = (bool)((byte)(uVar125 >> 9) & 1);
                            iVar185 = auVar214._36_4_;
                            bVar38 = (bool)((byte)(uVar125 >> 10) & 1);
                            iVar186 = auVar214._40_4_;
                            bVar39 = (bool)((byte)(uVar125 >> 0xb) & 1);
                            iVar187 = auVar214._44_4_;
                            bVar40 = (bool)((byte)(uVar125 >> 0xc) & 1);
                            iVar188 = auVar214._48_4_;
                            bVar41 = (bool)((byte)(uVar125 >> 0xd) & 1);
                            iVar189 = auVar214._52_4_;
                            bVar42 = (bool)((byte)(uVar125 >> 0xe) & 1);
                            iVar190 = auVar214._56_4_;
                            bVar43 = SUB81(uVar125 >> 0xf,0);
                            iVar191 = auVar214._60_4_;
                            bVar27 = (bool)((byte)uVar124 & 1);
                            uVar126 = (uint)bVar27 * iVar105 |
                                      (uint)!bVar27 *
                                      ((uint)(bVar26 & 1) * auVar77._0_4_ |
                                      (uint)!(bool)(bVar26 & 1) * iVar105);
                            bVar27 = (bool)((byte)(uVar124 >> 1) & 1);
                            uVar162 = (uint)bVar27 * iVar177 |
                                      (uint)!bVar27 *
                                      ((uint)bVar28 * auVar77._4_4_ | (uint)!bVar28 * iVar177);
                            auVar214._4_4_ = uVar162;
                            auVar214._0_4_ = uVar126;
                            bVar27 = (bool)((byte)(uVar124 >> 2) & 1);
                            uVar163 = (uint)bVar27 * iVar178 |
                                      (uint)!bVar27 *
                                      ((uint)bVar29 * auVar77._8_4_ | (uint)!bVar29 * iVar178);
                            auVar214._8_4_ = uVar163;
                            bVar27 = (bool)((byte)(uVar124 >> 3) & 1);
                            uVar164 = (uint)bVar27 * iVar179 |
                                      (uint)!bVar27 *
                                      ((uint)bVar30 * auVar77._12_4_ | (uint)!bVar30 * iVar179);
                            auVar214._12_4_ = uVar164;
                            bVar27 = (bool)((byte)(uVar124 >> 4) & 1);
                            uVar165 = (uint)bVar27 * iVar180 |
                                      (uint)!bVar27 *
                                      ((uint)bVar31 * auVar77._16_4_ | (uint)!bVar31 * iVar180);
                            auVar214._16_4_ = uVar165;
                            bVar27 = (bool)((byte)(uVar124 >> 5) & 1);
                            uVar166 = (uint)bVar27 * iVar181 |
                                      (uint)!bVar27 *
                                      ((uint)bVar32 * auVar77._20_4_ | (uint)!bVar32 * iVar181);
                            auVar214._20_4_ = uVar166;
                            bVar27 = (bool)((byte)(uVar124 >> 6) & 1);
                            uVar167 = (uint)bVar27 * iVar182 |
                                      (uint)!bVar27 *
                                      ((uint)bVar33 * auVar77._24_4_ | (uint)!bVar33 * iVar182);
                            auVar214._24_4_ = uVar167;
                            bVar27 = (bool)((byte)(uVar124 >> 7) & 1);
                            uVar168 = (uint)bVar27 * iVar183 |
                                      (uint)!bVar27 *
                                      ((uint)bVar34 * auVar77._28_4_ | (uint)!bVar34 * iVar183);
                            auVar214._28_4_ = uVar168;
                            bVar27 = (bool)((byte)(uVar124 >> 8) & 1);
                            uVar169 = (uint)bVar27 * iVar184 |
                                      (uint)!bVar27 *
                                      ((uint)(bVar36 & 1) * auVar77._32_4_ |
                                      (uint)!(bool)(bVar36 & 1) * iVar184);
                            auVar214._32_4_ = uVar169;
                            bVar27 = (bool)((byte)(uVar124 >> 9) & 1);
                            uVar170 = (uint)bVar27 * iVar185 |
                                      (uint)!bVar27 *
                                      ((uint)bVar37 * auVar77._36_4_ | (uint)!bVar37 * iVar185);
                            auVar214._36_4_ = uVar170;
                            bVar27 = (bool)((byte)(uVar124 >> 10) & 1);
                            uVar171 = (uint)bVar27 * iVar186 |
                                      (uint)!bVar27 *
                                      ((uint)bVar38 * auVar77._40_4_ | (uint)!bVar38 * iVar186);
                            auVar214._40_4_ = uVar171;
                            bVar27 = (bool)((byte)(uVar124 >> 0xb) & 1);
                            uVar172 = (uint)bVar27 * iVar187 |
                                      (uint)!bVar27 *
                                      ((uint)bVar39 * auVar77._44_4_ | (uint)!bVar39 * iVar187);
                            auVar214._44_4_ = uVar172;
                            bVar27 = (bool)((byte)(uVar124 >> 0xc) & 1);
                            uVar173 = (uint)bVar27 * iVar188 |
                                      (uint)!bVar27 *
                                      ((uint)bVar40 * auVar77._48_4_ | (uint)!bVar40 * iVar188);
                            auVar214._48_4_ = uVar173;
                            bVar27 = (bool)((byte)(uVar124 >> 0xd) & 1);
                            uVar174 = (uint)bVar27 * iVar189 |
                                      (uint)!bVar27 *
                                      ((uint)bVar41 * auVar77._52_4_ | (uint)!bVar41 * iVar189);
                            auVar214._52_4_ = uVar174;
                            bVar27 = (bool)((byte)(uVar124 >> 0xe) & 1);
                            uVar175 = (uint)bVar27 * iVar190 |
                                      (uint)!bVar27 *
                                      ((uint)bVar42 * auVar77._56_4_ | (uint)!bVar42 * iVar190);
                            auVar214._56_4_ = uVar175;
                            bVar27 = SUB81(uVar124 >> 0xf,0);
                            uVar176 = (uint)bVar27 * iVar191 |
                                      (uint)!bVar27 *
                                      ((uint)bVar43 * auVar77._60_4_ | (uint)!bVar43 * iVar191);
                            auVar214._60_4_ = uVar176;
                            uVar119 = uVar119 + 0x10;
                            auVar205 = vpaddq_avx512f(auVar205,auVar259);
                            auVar208 = vpaddq_avx512f(auVar208,auVar259);
                            auVar211 = vpaddd_avx512f(auVar211,auVar260);
                          } while (uVar122 != uVar119);
                          bVar27 = (bool)((byte)uVar45 & 1);
                          bVar28 = (bool)((byte)(uVar123 >> 1) & 1);
                          auVar81._4_4_ = bVar28 * uVar162 | (uint)!bVar28 * iVar177;
                          auVar81._0_4_ = bVar27 * uVar126 | (uint)!bVar27 * iVar105;
                          bVar27 = (bool)((byte)(uVar123 >> 2) & 1);
                          auVar81._8_4_ = bVar27 * uVar163 | (uint)!bVar27 * iVar178;
                          bVar27 = (bool)((byte)(uVar123 >> 3) & 1);
                          auVar81._12_4_ = bVar27 * uVar164 | (uint)!bVar27 * iVar179;
                          bVar27 = (bool)((byte)(uVar123 >> 4) & 1);
                          auVar81._16_4_ = bVar27 * uVar165 | (uint)!bVar27 * iVar180;
                          bVar27 = (bool)((byte)(uVar123 >> 5) & 1);
                          auVar81._20_4_ = bVar27 * uVar166 | (uint)!bVar27 * iVar181;
                          bVar27 = (bool)((byte)(uVar123 >> 6) & 1);
                          auVar81._24_4_ = bVar27 * uVar167 | (uint)!bVar27 * iVar182;
                          bVar27 = (bool)((byte)(uVar123 >> 7) & 1);
                          auVar81._28_4_ = bVar27 * uVar168 | (uint)!bVar27 * iVar183;
                          auVar81._32_4_ =
                               (bVar35 & 1) * uVar169 | (uint)!(bool)(bVar35 & 1) * iVar184;
                          bVar27 = (bool)(bVar35 >> 1 & 1);
                          auVar81._36_4_ = bVar27 * uVar170 | (uint)!bVar27 * iVar185;
                          bVar27 = (bool)(bVar35 >> 2 & 1);
                          auVar81._40_4_ = bVar27 * uVar171 | (uint)!bVar27 * iVar186;
                          bVar27 = (bool)(bVar35 >> 3 & 1);
                          auVar81._44_4_ = bVar27 * uVar172 | (uint)!bVar27 * iVar187;
                          bVar27 = (bool)(bVar35 >> 4 & 1);
                          auVar81._48_4_ = bVar27 * uVar173 | (uint)!bVar27 * iVar188;
                          bVar27 = (bool)(bVar35 >> 5 & 1);
                          auVar81._52_4_ = bVar27 * uVar174 | (uint)!bVar27 * iVar189;
                          bVar27 = (bool)(bVar35 >> 6 & 1);
                          auVar81._56_4_ = bVar27 * uVar175 | (uint)!bVar27 * iVar190;
                          auVar81._60_4_ =
                               (bVar35 >> 7) * uVar176 | (uint)!(bool)(bVar35 >> 7) * iVar191;
                          auVar161 = vextractf64x4_avx512f(auVar81,1);
                          auVar205 = vaddps_avx512f(auVar81,ZEXT3264(auVar161));
                          auVar135._0_4_ = auVar205._0_4_ + auVar205._16_4_;
                          auVar135._4_4_ = auVar205._4_4_ + auVar205._20_4_;
                          auVar135._8_4_ = auVar205._8_4_ + auVar205._24_4_;
                          auVar135._12_4_ = auVar205._12_4_ + auVar205._28_4_;
                          auVar127 = vshufpd_avx(auVar135,auVar135,1);
                          auVar136._0_4_ = auVar135._0_4_ + auVar127._0_4_;
                          auVar136._4_4_ = auVar135._4_4_ + auVar127._4_4_;
                          auVar136._8_4_ = auVar135._8_4_ + auVar127._8_4_;
                          auVar136._12_4_ = auVar135._12_4_ + auVar127._12_4_;
                          auVar127 = vhaddps_avx(auVar136,auVar136);
                          auVar205 = ZEXT1664(auVar127);
                        }
                        auVar127 = auVar205._0_16_;
                        uVar112 = uVar112 + 1;
                        pvVar118 = (void *)((long)pvVar118 + (ulong)uVar15 * 4);
                      } while (uVar112 != uVar111);
                    }
                    __x = auVar127._0_4_;
                    fVar192 = __x;
                    switch(iVar110) {
                    case 1:
                      auVar127 = vmaxss_avx(auVar127,ZEXT416(0));
                      fVar192 = auVar127._0_4_;
                      break;
                    case 2:
                      uVar45 = vcmpss_avx512f(auVar127,ZEXT416(0),0xe);
                      bVar27 = (bool)((byte)uVar45 & 1);
                      fVar192 = (float)((uint)bVar27 * 0x3f800000 + (uint)!bVar27 * (int)*pfVar24) *
                                __x;
                      break;
                    case 3:
                      auVar127 = vmaxss_avx(auVar127,ZEXT416((uint)*pfVar24));
                      fVar192 = auVar127._0_4_;
                      if (pfVar24[1] < auVar127._0_4_) {
                        fVar192 = pfVar24[1];
                      }
                      break;
                    case 4:
                      auVar127 = vminss_avx(auVar127,SUB6416(ZEXT464(0x42b0c0a5),0));
                      auVar138._8_4_ = 0x80000000;
                      auVar138._0_8_ = 0x8000000080000000;
                      auVar138._12_4_ = 0x80000000;
                      auVar128 = vxorps_avx512vl(auVar127,auVar138);
                      uVar45 = vcmpss_avx512f(auVar127,ZEXT416(0xc2b0c0a5),1);
                      bVar27 = (bool)((byte)uVar45 & 1);
                      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                      fVar192 = expf((float)((uint)bVar27 * 0x42b0c0a5 +
                                            (uint)!bVar27 * auVar128._0_4_));
                      auVar260 = vpbroadcastd_avx512f(ZEXT416(0x10));
                      auVar259 = vpbroadcastq_avx512f(ZEXT816(0x10));
                      auVar258 = vpternlogd_avx512f(auVar258,auVar258,auVar258,0xff);
                      auVar257 = vpmovsxbd_avx512f(_DAT_005a9784);
                      auVar254 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      auVar196 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                      auVar195 = vmovdqu64_avx512f(local_b8);
                      auVar247 = ZEXT1264(ZEXT812(0));
                      fVar192 = 1.0 / (fVar192 + 1.0);
                      break;
                    case 5:
                      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                      fVar192 = expf(__x);
                      fVar192 = logf(fVar192 + 1.0);
                      fVar192 = tanhf(fVar192);
                      auVar260 = vpbroadcastd_avx512f(ZEXT416(0x10));
                      auVar259 = vpbroadcastq_avx512f(ZEXT816(0x10));
                      auVar258 = vpternlogd_avx512f(auVar258,auVar258,auVar258,0xff);
                      auVar257 = vpmovsxbd_avx512f(_DAT_005a9784);
                      auVar254 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      auVar196 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                      auVar195 = vmovdqu64_avx512f(local_b8);
                      auVar247 = ZEXT1264(ZEXT812(0));
                      fVar192 = fVar192 * __x;
                      break;
                    case 6:
                      fVar2 = *pfVar24;
                      auVar137._8_4_ = 0x80000000;
                      auVar137._0_8_ = 0x8000000080000000;
                      auVar137._12_4_ = 0x80000000;
                      auVar128 = vxorps_avx512vl(ZEXT416((uint)pfVar24[1]),auVar137);
                      fVar199 = auVar128._0_4_ / fVar2;
                      fVar192 = 0.0;
                      if ((fVar199 <= __x) && (fVar192 = __x, __x <= fVar199 + 1.0 / fVar2)) {
                        auVar127 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar127,
                                                   ZEXT416((uint)pfVar24[1]));
                        fVar192 = auVar127._0_4_ * __x;
                      }
                    }
                    *local_350 = fVar192;
                    local_350 = local_350 + 1;
                    iVar117 = iVar117 + 1;
                  } while (iVar117 != _w);
                }
                local_248 = local_248 + 1;
              } while (local_248 != _h);
            }
            local_330 = local_330 + 1;
            local_2f0 = (void *)((long)local_2f0 + local_1e8._0_8_);
          } while (local_330 != uVar109);
        }
      }
      else if ((iVar113 == 4) && (0 < (int)uVar15)) {
        uVar17 = vpcmpd_avx512vl((undefined1  [16])0x0,local_1d8,1);
        auVar254._56_8_ = 0;
        auVar254._0_56_ = local_b8._8_56_;
        local_b8 = auVar254 << 0x40;
        auVar197._8_4_ = 0x42b0c0a5;
        auVar197._0_8_ = 0x42b0c0a542b0c0a5;
        auVar197._12_4_ = 0x42b0c0a5;
        auVar200._8_4_ = 0xc2b0c0a5;
        auVar200._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar200._12_4_ = 0xc2b0c0a5;
        auVar203._8_4_ = 0x3f000000;
        auVar203._0_8_ = 0x3f0000003f000000;
        auVar203._12_4_ = 0x3f000000;
        auVar206._8_4_ = 0x3fb8aa3b;
        auVar206._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar206._12_4_ = 0x3fb8aa3b;
        auVar209._8_4_ = 0x3f800000;
        auVar209._0_8_ = 0x3f8000003f800000;
        auVar209._12_4_ = 0x3f800000;
        auVar212._8_4_ = 0x3f318000;
        auVar212._0_8_ = 0x3f3180003f318000;
        auVar212._12_4_ = 0x3f318000;
        auVar127 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar243._8_4_ = 0x3ab743ce;
        auVar243._0_8_ = 0x3ab743ce3ab743ce;
        auVar243._12_4_ = 0x3ab743ce;
        auVar245._8_4_ = 0x3c088908;
        auVar245._0_8_ = 0x3c0889083c088908;
        auVar245._12_4_ = 0x3c088908;
        auVar248._8_4_ = 0x3d2aa9c1;
        auVar248._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar248._12_4_ = 0x3d2aa9c1;
        auVar250._8_4_ = 0x3e2aaaaa;
        auVar250._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar250._12_4_ = 0x3e2aaaaa;
        auVar252._8_4_ = 0x3f800000;
        auVar252._0_8_ = 0x3f8000003f800000;
        auVar252._12_4_ = 0x3f800000;
        auVar255._8_4_ = 0xb95e8083;
        auVar255._0_8_ = 0xb95e8083b95e8083;
        auVar255._12_4_ = 0xb95e8083;
        auVar128 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar129 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar130 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar131 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar132 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar133 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar134 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar135 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar136 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar137 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar138 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar139 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        do {
          if (((uVar17 & 0xf) >> 1 & 1) != 0) {
            pvVar19 = (this->weight_data_tm).data;
            sVar120 = bottom_blob->cstep;
            sVar20 = bottom_blob->elemsize;
            pvVar21 = bottom_blob->data;
            iVar113 = bottom_blob->w;
            pauVar114 = (undefined1 (*) [16])
                        (local_298.cstep * local_b8._0_8_ * local_298.elemsize +
                        (long)local_298.data);
            iVar106 = 0;
            do {
              if ((uVar17 & 1) != 0) {
                iVar110 = 0;
                local_374 = -local_1e8._0_4_;
                do {
                  if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                    auVar195 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar195 = ZEXT1664(*(undefined1 (*) [16])
                                         ((long)(this->super_DeconvolutionDepthWise).bias_data.data
                                         + local_b8._0_8_ * 0x10));
                  }
                  auVar142 = auVar195._0_16_;
                  iVar16 = (this->super_DeconvolutionDepthWise).kernel_h;
                  if (0 < iVar16) {
                    iVar108 = (this->super_DeconvolutionDepthWise).stride_h;
                    uVar111 = (this->super_DeconvolutionDepthWise).kernel_w;
                    iVar117 = (this->super_DeconvolutionDepthWise).stride_w;
                    uVar122 = 0;
                    lVar121 = 0;
                    do {
                      iVar103 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar121 +
                                (iVar106 - local_1e8._4_4_);
                      if ((((-1 < iVar103) && (iVar104 = iVar103 / iVar108, iVar103 % iVar108 == 0))
                          && (iVar104 < iStack_244)) && (0 < (int)uVar111)) {
                        uVar112 = uVar122;
                        uVar119 = (ulong)uVar111;
                        iVar103 = local_374;
                        do {
                          if ((-1 < iVar103) &&
                             (iVar105 = iVar103 / iVar117,
                             iVar105 < local_248 && iVar103 % iVar117 == 0)) {
                            auVar142 = vfmadd231ps_fma(auVar195._0_16_,
                                                       *(undefined1 (*) [16])
                                                        ((long)pvVar21 +
                                                        (long)(iVar105 << 2) * 4 +
                                                        (long)iVar104 * (long)iVar113 * sVar20 +
                                                        sVar120 * local_b8._0_8_ * sVar20),
                                                       *(undefined1 (*) [16])
                                                        ((long)pvVar19 +
                                                        (uVar112 & 0xffffffff) * 4 +
                                                        (long)(iVar102 * 4 * local_b8._0_4_) * 4));
                            auVar195 = ZEXT1664(auVar142);
                          }
                          iVar103 = iVar103 + (this->super_DeconvolutionDepthWise).dilation_w;
                          uVar112 = uVar112 + 4;
                          uVar119 = uVar119 - 1;
                        } while (uVar119 != 0);
                      }
                      auVar142 = auVar195._0_16_;
                      lVar121 = lVar121 + 1;
                      uVar122 = uVar122 + (ulong)uVar111 * 4;
                    } while (lVar121 != iVar16);
                  }
                  switch((this->super_DeconvolutionDepthWise).activation_type) {
                  case 1:
                    auVar142 = vmaxps_avx(auVar142,(undefined1  [16])0x0);
                    break;
                  case 2:
                    auVar143 = vmaxps_avx(auVar142,(undefined1  [16])0x0);
                    auVar142 = vminps_avx(auVar142,(undefined1  [16])0x0);
                    uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                    auVar52._4_4_ = uVar1;
                    auVar52._0_4_ = uVar1;
                    auVar52._8_4_ = uVar1;
                    auVar52._12_4_ = uVar1;
                    auVar142 = vfmadd132ps_avx512vl(auVar142,auVar143,auVar52);
                    break;
                  case 3:
                    puVar22 = (undefined4 *)
                              (this->super_DeconvolutionDepthWise).activation_params.data;
                    uVar1 = *puVar22;
                    auVar50._4_4_ = uVar1;
                    auVar50._0_4_ = uVar1;
                    auVar50._8_4_ = uVar1;
                    auVar50._12_4_ = uVar1;
                    auVar142 = vmaxps_avx512vl(auVar142,auVar50);
                    uVar1 = puVar22[1];
                    auVar51._4_4_ = uVar1;
                    auVar51._0_4_ = uVar1;
                    auVar51._8_4_ = uVar1;
                    auVar51._12_4_ = uVar1;
                    auVar142 = vminps_avx512vl(auVar142,auVar51);
                    break;
                  case 4:
                    auVar49._8_4_ = 0x80000000;
                    auVar49._0_8_ = 0x8000000080000000;
                    auVar49._12_4_ = 0x80000000;
                    auVar142 = vxorps_avx512vl(auVar142,auVar49);
                    auVar142 = vminps_avx(auVar142,auVar197);
                    auVar142 = vmaxps_avx(auVar142,auVar200);
                    auVar143 = vfmadd231ps_fma(auVar203,auVar142,auVar206);
                    auVar141 = vcvttps2dq_avx512vl(auVar143);
                    auVar141 = vcvtdq2ps_avx512vl(auVar141);
                    uVar122 = vcmpps_avx512vl(auVar143,auVar141,1);
                    auVar143 = vsubps_avx512vl(auVar141,auVar209);
                    bVar27 = (bool)((byte)uVar122 & 1);
                    bVar28 = (bool)((byte)(uVar122 >> 1) & 1);
                    auVar65._4_4_ = (uint)bVar28 * auVar143._4_4_ | (uint)!bVar28 * auVar141._4_4_;
                    auVar65._0_4_ = (uint)bVar27 * auVar143._0_4_ | (uint)!bVar27 * auVar141._0_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 2) & 1);
                    auVar65._8_4_ = (uint)bVar27 * auVar143._8_4_ | (uint)!bVar27 * auVar141._8_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 3) & 1);
                    auVar65._12_4_ =
                         (uint)bVar27 * auVar143._12_4_ | (uint)!bVar27 * auVar141._12_4_;
                    auVar143 = vfmsub231ps_avx512vl(auVar142,auVar65,auVar212);
                    auVar142._8_4_ = 0x395e8083;
                    auVar142._0_8_ = 0x395e8083395e8083;
                    auVar142._12_4_ = 0x395e8083;
                    auVar143 = vfmsub231ps_avx512vl(auVar143,auVar65,auVar142);
                    auVar215._0_4_ = auVar143._0_4_ * auVar143._0_4_;
                    auVar215._4_4_ = auVar143._4_4_ * auVar143._4_4_;
                    auVar215._8_4_ = auVar143._8_4_ * auVar143._8_4_;
                    auVar215._12_4_ = auVar143._12_4_ * auVar143._12_4_;
                    auVar142 = vfmadd213ps_fma(auVar127,auVar143,auVar243);
                    auVar142 = vfmadd213ps_fma(auVar142,auVar143,auVar245);
                    auVar142 = vfmadd213ps_fma(auVar142,auVar143,auVar248);
                    auVar142 = vfmadd213ps_fma(auVar142,auVar143,auVar250);
                    auVar142 = vfmadd213ps_fma(auVar142,auVar143,auVar203);
                    auVar142 = vfmadd213ps_fma(auVar142,auVar215,auVar143);
                    auVar193._0_4_ = auVar142._0_4_ + 1.0;
                    auVar193._4_4_ = auVar142._4_4_ + 1.0;
                    auVar193._8_4_ = auVar142._8_4_ + 1.0;
                    auVar193._12_4_ = auVar142._12_4_ + 1.0;
                    auVar142 = vcvttps2dq_avx512vl(auVar65);
                    auVar142 = vpslld_avx(auVar142,0x17);
                    auVar142 = vpaddd_avx(auVar142,auVar252);
                    auVar142 = vfmadd213ps_fma(auVar142,auVar193,auVar209);
                    auVar142 = vdivps_avx(auVar209,auVar142);
                    break;
                  case 5:
                    auVar143 = vminps_avx(auVar142,auVar197);
                    auVar143 = vmaxps_avx(auVar143,auVar200);
                    auVar141 = vfmadd213ps_fma(auVar206,auVar143,auVar203);
                    auVar140 = vcvttps2dq_avx512vl(auVar141);
                    auVar140 = vcvtdq2ps_avx512vl(auVar140);
                    uVar122 = vcmpps_avx512vl(auVar141,auVar140,1);
                    auVar141 = vsubps_avx512vl(auVar140,auVar209);
                    bVar27 = (bool)((byte)uVar122 & 1);
                    bVar28 = (bool)((byte)(uVar122 >> 1) & 1);
                    auVar60._4_4_ = (uint)bVar28 * auVar141._4_4_ | (uint)!bVar28 * auVar140._4_4_;
                    auVar60._0_4_ = (uint)bVar27 * auVar141._0_4_ | (uint)!bVar27 * auVar140._0_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 2) & 1);
                    auVar60._8_4_ = (uint)bVar27 * auVar141._8_4_ | (uint)!bVar27 * auVar140._8_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 3) & 1);
                    auVar60._12_4_ =
                         (uint)bVar27 * auVar141._12_4_ | (uint)!bVar27 * auVar140._12_4_;
                    auVar143 = vfmsub231ps_avx512vl(auVar143,auVar60,auVar212);
                    auVar143 = vfnmsub231ps_avx512vl(auVar143,auVar60,auVar255);
                    auVar238._0_4_ = auVar143._0_4_ * auVar143._0_4_;
                    auVar238._4_4_ = auVar143._4_4_ * auVar143._4_4_;
                    auVar238._8_4_ = auVar143._8_4_ * auVar143._8_4_;
                    auVar238._12_4_ = auVar143._12_4_ * auVar143._12_4_;
                    auVar141 = vfmadd213ps_avx512vl(auVar127,auVar143,auVar243);
                    auVar141 = vfmadd213ps_avx512vl(auVar141,auVar143,auVar245);
                    auVar141 = vfmadd213ps_avx512vl(auVar141,auVar143,auVar248);
                    auVar141 = vfmadd213ps_avx512vl(auVar141,auVar143,auVar250);
                    auVar141 = vfmadd213ps_avx512vl(auVar141,auVar143,auVar203);
                    auVar143 = vfmadd213ps_avx512vl(auVar141,auVar238,auVar143);
                    auVar141 = vaddps_avx512vl(auVar143,auVar209);
                    auVar143 = vcvttps2dq_avx512vl(auVar60);
                    auVar143 = vpslld_avx(auVar143,0x17);
                    auVar143 = vpaddd_avx(auVar143,auVar252);
                    auVar143 = vfmadd213ps_fma(auVar143,auVar141,auVar209);
                    uVar122 = vcmpps_avx512vl(auVar143,(undefined1  [16])0x0,2);
                    auVar239._8_4_ = 0x800000;
                    auVar239._0_8_ = 0x80000000800000;
                    auVar239._12_4_ = 0x800000;
                    auVar143 = vmaxps_avx512vl(auVar143,auVar239);
                    auVar239 = vpsrld_avx(auVar143,0x17);
                    auVar141 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar47._8_4_ = 0x3f000000;
                    auVar47._0_8_ = 0x3f0000003f000000;
                    auVar47._12_4_ = 0x3f000000;
                    auVar143 = vpternlogd_avx512vl(auVar143,auVar141,auVar47,0xea);
                    uVar112 = vcmpps_avx512vl(auVar143,auVar128,1);
                    auVar141 = vaddps_avx512vl(auVar143,auVar129);
                    auVar143 = vaddps_avx512vl(auVar141,auVar143);
                    bVar27 = (bool)((byte)uVar112 & 1);
                    bVar28 = (bool)((byte)(uVar112 >> 1) & 1);
                    auVar61._4_4_ = (uint)bVar28 * auVar143._4_4_ | (uint)!bVar28 * auVar141._4_4_;
                    auVar61._0_4_ = (uint)bVar27 * auVar143._0_4_ | (uint)!bVar27 * auVar141._0_4_;
                    bVar27 = (bool)((byte)(uVar112 >> 2) & 1);
                    auVar61._8_4_ = (uint)bVar27 * auVar143._8_4_ | (uint)!bVar27 * auVar141._8_4_;
                    bVar27 = (bool)((byte)(uVar112 >> 3) & 1);
                    auVar61._12_4_ =
                         (uint)bVar27 * auVar143._12_4_ | (uint)!bVar27 * auVar141._12_4_;
                    auVar141 = vmulps_avx512vl(auVar61,auVar61);
                    auVar143 = vfmadd213ps_avx512vl(auVar130,auVar61,auVar131);
                    auVar143 = vfmadd213ps_avx512vl(auVar143,auVar61,auVar132);
                    auVar143 = vfmadd213ps_avx512vl(auVar143,auVar61,auVar133);
                    auVar143 = vfmadd213ps_avx512vl(auVar143,auVar61,auVar134);
                    auVar143 = vfmadd213ps_avx512vl(auVar143,auVar61,auVar135);
                    auVar143 = vfmadd213ps_avx512vl(auVar143,auVar61,auVar136);
                    auVar143 = vfmadd213ps_avx512vl(auVar143,auVar61,auVar137);
                    auVar143 = vfmadd213ps_avx512vl(auVar143,auVar61,auVar138);
                    auVar140 = vmulps_avx512vl(auVar141,auVar61);
                    auVar140 = vmulps_avx512vl(auVar140,auVar143);
                    auVar48._8_4_ = 0xffffff82;
                    auVar48._0_8_ = 0xffffff82ffffff82;
                    auVar48._12_4_ = 0xffffff82;
                    auVar143 = vpaddd_avx512vl(auVar239,auVar48);
                    auVar143 = vcvtdq2ps_avx(auVar143);
                    auVar239 = vsubps_avx512vl(auVar143,auVar209);
                    bVar27 = (bool)((byte)uVar112 & 1);
                    bVar28 = (bool)((byte)(uVar112 >> 1) & 1);
                    auVar62._4_4_ = (uint)bVar28 * auVar239._4_4_ | (uint)!bVar28 * auVar143._4_4_;
                    auVar62._0_4_ = (uint)bVar27 * auVar239._0_4_ | (uint)!bVar27 * auVar143._0_4_;
                    bVar27 = (bool)((byte)(uVar112 >> 2) & 1);
                    auVar62._8_4_ = (uint)bVar27 * auVar239._8_4_ | (uint)!bVar27 * auVar143._8_4_;
                    bVar27 = (bool)((byte)(uVar112 >> 3) & 1);
                    auVar62._12_4_ =
                         (uint)bVar27 * auVar239._12_4_ | (uint)!bVar27 * auVar143._12_4_;
                    auVar143 = vfmadd231ps_avx512vl(auVar140,auVar62,auVar255);
                    auVar143 = vfmsub231ps_avx512vl(auVar143,auVar203,auVar141);
                    auVar143 = vsubps_avx512vl(auVar143,auVar61);
                    auVar143 = vfnmadd231ps_fma(auVar143,auVar212,auVar62);
                    auVar141 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar27 = (bool)((byte)uVar122 & 1);
                    bVar28 = (bool)((byte)(uVar122 >> 1) & 1);
                    auVar63._4_4_ =
                         (uint)bVar28 * auVar141._4_4_ |
                         (uint)!bVar28 * (int)(auVar143._4_4_ + auVar143._4_4_);
                    auVar63._0_4_ =
                         (uint)bVar27 * auVar141._0_4_ |
                         (uint)!bVar27 * (int)(auVar143._0_4_ + auVar143._0_4_);
                    bVar27 = (bool)((byte)(uVar122 >> 2) & 1);
                    auVar63._8_4_ =
                         (uint)bVar27 * auVar141._8_4_ |
                         (uint)!bVar27 * (int)(auVar143._8_4_ + auVar143._8_4_);
                    bVar27 = (bool)((byte)(uVar122 >> 3) & 1);
                    auVar63._12_4_ =
                         (uint)bVar27 * auVar141._12_4_ |
                         (uint)!bVar27 * (int)(auVar143._12_4_ + auVar143._12_4_);
                    auVar143 = vminps_avx(auVar63,auVar197);
                    auVar143 = vmaxps_avx(auVar143,auVar200);
                    auVar141 = vfmadd213ps_fma(auVar206,auVar143,auVar203);
                    auVar140 = vcvttps2dq_avx512vl(auVar141);
                    auVar140 = vcvtdq2ps_avx512vl(auVar140);
                    uVar122 = vcmpps_avx512vl(auVar141,auVar140,1);
                    auVar141 = vsubps_avx512vl(auVar140,auVar209);
                    bVar27 = (bool)((byte)uVar122 & 1);
                    bVar28 = (bool)((byte)(uVar122 >> 1) & 1);
                    auVar64._4_4_ = (uint)bVar28 * auVar141._4_4_ | (uint)!bVar28 * auVar140._4_4_;
                    auVar64._0_4_ = (uint)bVar27 * auVar141._0_4_ | (uint)!bVar27 * auVar140._0_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 2) & 1);
                    auVar64._8_4_ = (uint)bVar27 * auVar141._8_4_ | (uint)!bVar27 * auVar140._8_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 3) & 1);
                    auVar64._12_4_ =
                         (uint)bVar27 * auVar141._12_4_ | (uint)!bVar27 * auVar140._12_4_;
                    auVar143 = vfmsub231ps_avx512vl(auVar143,auVar64,auVar212);
                    auVar143 = vfnmsub231ps_avx512vl(auVar143,auVar64,auVar255);
                    auVar240._0_4_ = auVar143._0_4_ * auVar143._0_4_;
                    auVar240._4_4_ = auVar143._4_4_ * auVar143._4_4_;
                    auVar240._8_4_ = auVar143._8_4_ * auVar143._8_4_;
                    auVar240._12_4_ = auVar143._12_4_ * auVar143._12_4_;
                    auVar141 = vfmadd213ps_avx512vl(auVar127,auVar143,auVar243);
                    auVar141 = vfmadd213ps_avx512vl(auVar141,auVar143,auVar245);
                    auVar141 = vfmadd213ps_avx512vl(auVar141,auVar143,auVar248);
                    auVar141 = vfmadd213ps_avx512vl(auVar141,auVar143,auVar250);
                    auVar141 = vfmadd213ps_avx512vl(auVar141,auVar143,auVar203);
                    auVar143 = vfmadd213ps_avx512vl(auVar141,auVar240,auVar143);
                    auVar141 = vaddps_avx512vl(auVar143,auVar209);
                    auVar143 = vcvttps2dq_avx512vl(auVar64);
                    auVar143 = vpslld_avx(auVar143,0x17);
                    auVar143 = vpaddd_avx(auVar143,auVar252);
                    auVar143 = vfmadd213ps_fma(auVar143,auVar141,auVar209);
                    auVar143 = vdivps_avx512vl(auVar139,auVar143);
                    auVar142 = vfmsub231ps_fma(auVar142,auVar142,auVar143);
                    break;
                  case 6:
                    puVar22 = (undefined4 *)
                              (this->super_DeconvolutionDepthWise).activation_params.data;
                    uVar1 = *puVar22;
                    auVar140._4_4_ = uVar1;
                    auVar140._0_4_ = uVar1;
                    auVar140._8_4_ = uVar1;
                    auVar140._12_4_ = uVar1;
                    uVar1 = puVar22[1];
                    auVar143._4_4_ = uVar1;
                    auVar143._0_4_ = uVar1;
                    auVar143._8_4_ = uVar1;
                    auVar143._12_4_ = uVar1;
                    auVar143 = vfmadd213ps_avx512vl(auVar140,auVar142,auVar143);
                    auVar143 = vmaxps_avx(auVar143,(undefined1  [16])0x0);
                    auVar143 = vminps_avx(auVar143,auVar209);
                    auVar141._0_4_ = auVar143._0_4_ * auVar142._0_4_;
                    auVar141._4_4_ = auVar143._4_4_ * auVar142._4_4_;
                    auVar141._8_4_ = auVar143._8_4_ * auVar142._8_4_;
                    auVar141._12_4_ = auVar143._12_4_ * auVar142._12_4_;
                    auVar142 = auVar141;
                  }
                  *pauVar114 = auVar142;
                  pauVar114 = pauVar114 + 1;
                  iVar110 = iVar110 + 1;
                  local_374 = local_374 + 1;
                } while (iVar110 != _w);
              }
              iVar106 = iVar106 + 1;
            } while (iVar106 != _h);
          }
          uVar122 = local_b8._0_8_ + 1;
          local_b8._0_8_ = uVar122;
        } while (uVar122 != uVar109);
      }
    }
    else if (iVar113 == 8) {
      if (0 < (int)uVar15) {
        uVar17 = vpcmpd_avx512vl((undefined1  [16])0x0,local_1d8,1);
        auVar195._56_8_ = 0;
        auVar195._0_56_ = local_b8._8_56_;
        local_b8 = auVar195 << 0x40;
        auVar198._8_4_ = 0x42b0c0a5;
        auVar198._0_8_ = 0x42b0c0a542b0c0a5;
        auVar198._12_4_ = 0x42b0c0a5;
        auVar198._16_4_ = 0x42b0c0a5;
        auVar198._20_4_ = 0x42b0c0a5;
        auVar198._24_4_ = 0x42b0c0a5;
        auVar198._28_4_ = 0x42b0c0a5;
        auVar201._8_4_ = 0xc2b0c0a5;
        auVar201._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar201._12_4_ = 0xc2b0c0a5;
        auVar201._16_4_ = 0xc2b0c0a5;
        auVar201._20_4_ = 0xc2b0c0a5;
        auVar201._24_4_ = 0xc2b0c0a5;
        auVar201._28_4_ = 0xc2b0c0a5;
        auVar204._8_4_ = 0x3f000000;
        auVar204._0_8_ = 0x3f0000003f000000;
        auVar204._12_4_ = 0x3f000000;
        auVar204._16_4_ = 0x3f000000;
        auVar204._20_4_ = 0x3f000000;
        auVar204._24_4_ = 0x3f000000;
        auVar204._28_4_ = 0x3f000000;
        auVar207._8_4_ = 0x3fb8aa3b;
        auVar207._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar207._12_4_ = 0x3fb8aa3b;
        auVar207._16_4_ = 0x3fb8aa3b;
        auVar207._20_4_ = 0x3fb8aa3b;
        auVar207._24_4_ = 0x3fb8aa3b;
        auVar207._28_4_ = 0x3fb8aa3b;
        auVar210._8_4_ = 0x3f800000;
        auVar210._0_8_ = 0x3f8000003f800000;
        auVar210._12_4_ = 0x3f800000;
        auVar210._16_4_ = 0x3f800000;
        auVar210._20_4_ = 0x3f800000;
        auVar210._24_4_ = 0x3f800000;
        auVar210._28_4_ = 0x3f800000;
        auVar213._8_4_ = 0x3f318000;
        auVar213._0_8_ = 0x3f3180003f318000;
        auVar213._12_4_ = 0x3f318000;
        auVar213._16_4_ = 0x3f318000;
        auVar213._20_4_ = 0x3f318000;
        auVar213._24_4_ = 0x3f318000;
        auVar213._28_4_ = 0x3f318000;
        auVar161 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar244._8_4_ = 0x3ab743ce;
        auVar244._0_8_ = 0x3ab743ce3ab743ce;
        auVar244._12_4_ = 0x3ab743ce;
        auVar244._16_4_ = 0x3ab743ce;
        auVar244._20_4_ = 0x3ab743ce;
        auVar244._24_4_ = 0x3ab743ce;
        auVar244._28_4_ = 0x3ab743ce;
        auVar246._8_4_ = 0x3c088908;
        auVar246._0_8_ = 0x3c0889083c088908;
        auVar246._12_4_ = 0x3c088908;
        auVar246._16_4_ = 0x3c088908;
        auVar246._20_4_ = 0x3c088908;
        auVar246._24_4_ = 0x3c088908;
        auVar246._28_4_ = 0x3c088908;
        auVar249._8_4_ = 0x3d2aa9c1;
        auVar249._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar249._12_4_ = 0x3d2aa9c1;
        auVar249._16_4_ = 0x3d2aa9c1;
        auVar249._20_4_ = 0x3d2aa9c1;
        auVar249._24_4_ = 0x3d2aa9c1;
        auVar249._28_4_ = 0x3d2aa9c1;
        auVar251._8_4_ = 0x3e2aaaaa;
        auVar251._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar251._12_4_ = 0x3e2aaaaa;
        auVar251._16_4_ = 0x3e2aaaaa;
        auVar251._20_4_ = 0x3e2aaaaa;
        auVar251._24_4_ = 0x3e2aaaaa;
        auVar251._28_4_ = 0x3e2aaaaa;
        auVar253._8_4_ = 0x3f800000;
        auVar253._0_8_ = 0x3f8000003f800000;
        auVar253._12_4_ = 0x3f800000;
        auVar253._16_4_ = 0x3f800000;
        auVar253._20_4_ = 0x3f800000;
        auVar253._24_4_ = 0x3f800000;
        auVar253._28_4_ = 0x3f800000;
        auVar256._8_4_ = 0xb95e8083;
        auVar256._0_8_ = 0xb95e8083b95e8083;
        auVar256._12_4_ = 0xb95e8083;
        auVar256._16_4_ = 0xb95e8083;
        auVar256._20_4_ = 0xb95e8083;
        auVar256._24_4_ = 0xb95e8083;
        auVar256._28_4_ = 0xb95e8083;
        auVar145 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar146 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar147 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar148 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar149 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar150 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar151 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar152 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar153 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar154 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar155 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar156 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          if (((uVar17 & 0xf) >> 1 & 1) != 0) {
            pvVar19 = (this->weight_data_tm).data;
            sVar120 = bottom_blob->cstep;
            sVar20 = bottom_blob->elemsize;
            pvVar21 = bottom_blob->data;
            iVar113 = bottom_blob->w;
            pauVar116 = (undefined1 (*) [32])
                        (local_298.cstep * local_b8._0_8_ * local_298.elemsize +
                        (long)local_298.data);
            iVar106 = 0;
            do {
              if ((uVar17 & 1) != 0) {
                iVar110 = 0;
                local_374 = -local_1e8._0_4_;
                do {
                  if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                    auVar195 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar195 = ZEXT3264(*(undefined1 (*) [32])
                                         ((long)(this->super_DeconvolutionDepthWise).bias_data.data
                                         + local_b8._0_8_ * 0x20));
                  }
                  iVar16 = (this->super_DeconvolutionDepthWise).kernel_h;
                  if (0 < iVar16) {
                    iVar108 = (this->super_DeconvolutionDepthWise).stride_h;
                    uVar111 = (this->super_DeconvolutionDepthWise).kernel_w;
                    iVar117 = (this->super_DeconvolutionDepthWise).stride_w;
                    uVar122 = 0;
                    lVar121 = 0;
                    do {
                      iVar103 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar121 +
                                (iVar106 - local_1e8._4_4_);
                      if ((((-1 < iVar103) && (iVar104 = iVar103 / iVar108, iVar103 % iVar108 == 0))
                          && (iVar104 < iStack_244)) && (0 < (int)uVar111)) {
                        uVar112 = uVar122;
                        uVar119 = (ulong)uVar111;
                        iVar103 = local_374;
                        do {
                          if ((-1 < iVar103) &&
                             (iVar105 = iVar103 / iVar117,
                             iVar105 < local_248 && iVar103 % iVar117 == 0)) {
                            auVar127 = vfmadd231ps_fma(auVar195._0_32_,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar21 +
                                                        (long)(iVar105 << 3) * 4 +
                                                        (long)iVar104 * (long)iVar113 * sVar20 +
                                                        sVar120 * local_b8._0_8_ * sVar20),
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar19 +
                                                        (uVar112 & 0xffffffff) * 4 +
                                                        (long)(iVar102 * 8 * local_b8._0_4_) * 4));
                            auVar195 = ZEXT1664(auVar127);
                          }
                          iVar103 = iVar103 + (this->super_DeconvolutionDepthWise).dilation_w;
                          uVar112 = uVar112 + 8;
                          uVar119 = uVar119 - 1;
                        } while (uVar119 != 0);
                      }
                      lVar121 = lVar121 + 1;
                      uVar122 = uVar122 + (ulong)uVar111 * 8;
                    } while (lVar121 != iVar16);
                  }
                  auVar160 = auVar195._0_32_;
                  iVar16 = (this->super_DeconvolutionDepthWise).activation_type;
                  if (5 < iVar16 - 1U) goto LAB_00433b4a;
                  auVar159 = ZEXT1632((undefined1  [16])0x0);
                  switch(iVar16) {
                  case 1:
                    auVar160 = vmaxps_avx(auVar160,ZEXT1632((undefined1  [16])0x0));
                    break;
                  case 2:
                    auVar157 = vmaxps_avx(auVar160,auVar159);
                    auVar160 = vminps_avx(auVar160,auVar159);
                    uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                    auVar58._4_4_ = uVar1;
                    auVar58._0_4_ = uVar1;
                    auVar58._8_4_ = uVar1;
                    auVar58._12_4_ = uVar1;
                    auVar58._16_4_ = uVar1;
                    auVar58._20_4_ = uVar1;
                    auVar58._24_4_ = uVar1;
                    auVar58._28_4_ = uVar1;
                    auVar160 = vfmadd132ps_avx512vl(auVar160,auVar157,auVar58);
                    break;
                  case 3:
                    puVar22 = (undefined4 *)
                              (this->super_DeconvolutionDepthWise).activation_params.data;
                    uVar1 = *puVar22;
                    auVar56._4_4_ = uVar1;
                    auVar56._0_4_ = uVar1;
                    auVar56._8_4_ = uVar1;
                    auVar56._12_4_ = uVar1;
                    auVar56._16_4_ = uVar1;
                    auVar56._20_4_ = uVar1;
                    auVar56._24_4_ = uVar1;
                    auVar56._28_4_ = uVar1;
                    auVar160 = vmaxps_avx512vl(auVar160,auVar56);
                    uVar1 = puVar22[1];
                    auVar57._4_4_ = uVar1;
                    auVar57._0_4_ = uVar1;
                    auVar57._8_4_ = uVar1;
                    auVar57._12_4_ = uVar1;
                    auVar57._16_4_ = uVar1;
                    auVar57._20_4_ = uVar1;
                    auVar57._24_4_ = uVar1;
                    auVar57._28_4_ = uVar1;
                    auVar160 = vminps_avx512vl(auVar160,auVar57);
                    break;
                  case 4:
                    auVar54._8_4_ = 0x80000000;
                    auVar54._0_8_ = 0x8000000080000000;
                    auVar54._12_4_ = 0x80000000;
                    auVar54._16_4_ = 0x80000000;
                    auVar54._20_4_ = 0x80000000;
                    auVar54._24_4_ = 0x80000000;
                    auVar54._28_4_ = 0x80000000;
                    auVar160 = vxorps_avx512vl(auVar160,auVar54);
                    auVar160 = vminps_avx(auVar160,auVar198);
                    auVar160 = vmaxps_avx(auVar160,auVar201);
                    auVar127 = vfmadd231ps_fma(auVar204,auVar160,auVar207);
                    auVar159 = vrndscaleps_avx512vl(ZEXT1632(auVar127),1);
                    uVar122 = vcmpps_avx512vl(ZEXT1632(auVar127),auVar159,1);
                    auVar157 = vsubps_avx512vl(auVar159,auVar210);
                    bVar27 = (bool)((byte)uVar122 & 1);
                    bVar28 = (bool)((byte)(uVar122 >> 1) & 1);
                    auVar71._4_4_ = (uint)bVar28 * auVar157._4_4_ | (uint)!bVar28 * auVar159._4_4_;
                    auVar71._0_4_ = (uint)bVar27 * auVar157._0_4_ | (uint)!bVar27 * auVar159._0_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 2) & 1);
                    auVar71._8_4_ = (uint)bVar27 * auVar157._8_4_ | (uint)!bVar27 * auVar159._8_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 3) & 1);
                    auVar71._12_4_ =
                         (uint)bVar27 * auVar157._12_4_ | (uint)!bVar27 * auVar159._12_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 4) & 1);
                    auVar71._16_4_ =
                         (uint)bVar27 * auVar157._16_4_ | (uint)!bVar27 * auVar159._16_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 5) & 1);
                    auVar71._20_4_ =
                         (uint)bVar27 * auVar157._20_4_ | (uint)!bVar27 * auVar159._20_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 6) & 1);
                    auVar71._24_4_ =
                         (uint)bVar27 * auVar157._24_4_ | (uint)!bVar27 * auVar159._24_4_;
                    bVar27 = SUB81(uVar122 >> 7,0);
                    auVar71._28_4_ =
                         (uint)bVar27 * auVar157._28_4_ | (uint)!bVar27 * auVar159._28_4_;
                    auVar160 = vfmsub231ps_avx512vl(auVar160,auVar71,auVar213);
                    auVar55._8_4_ = 0x395e8083;
                    auVar55._0_8_ = 0x395e8083395e8083;
                    auVar55._12_4_ = 0x395e8083;
                    auVar55._16_4_ = 0x395e8083;
                    auVar55._20_4_ = 0x395e8083;
                    auVar55._24_4_ = 0x395e8083;
                    auVar55._28_4_ = 0x395e8083;
                    auVar160 = vfmsub231ps_avx512vl(auVar160,auVar71,auVar55);
                    auVar216._0_4_ = auVar160._0_4_ * auVar160._0_4_;
                    auVar216._4_4_ = auVar160._4_4_ * auVar160._4_4_;
                    auVar216._8_4_ = auVar160._8_4_ * auVar160._8_4_;
                    auVar216._12_4_ = auVar160._12_4_ * auVar160._12_4_;
                    auVar216._16_4_ = auVar160._16_4_ * auVar160._16_4_;
                    auVar216._20_4_ = auVar160._20_4_ * auVar160._20_4_;
                    auVar216._24_4_ = auVar160._24_4_ * auVar160._24_4_;
                    auVar216._28_4_ = 0;
                    auVar127 = vfmadd213ps_fma(auVar161,auVar160,auVar244);
                    auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar160,auVar246);
                    auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar160,auVar249);
                    auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar160,auVar251);
                    auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar160,auVar204);
                    auVar127 = vfmadd213ps_fma(ZEXT1632(auVar127),auVar216,auVar160);
                    auVar194._0_4_ = auVar127._0_4_ + 1.0;
                    auVar194._4_4_ = auVar127._4_4_ + 1.0;
                    auVar194._8_4_ = auVar127._8_4_ + 1.0;
                    auVar194._12_4_ = auVar127._12_4_ + 1.0;
                    auVar194._16_4_ = 0x3f800000;
                    auVar194._20_4_ = 0x3f800000;
                    auVar194._24_4_ = 0x3f800000;
                    auVar194._28_4_ = 0x3f800000;
                    auVar160 = vcvttps2dq_avx512vl(auVar71);
                    auVar160 = vpslld_avx2(auVar160,0x17);
                    auVar160 = vpaddd_avx2(auVar160,auVar253);
                    auVar127 = vfmadd213ps_fma(auVar160,auVar194,auVar210);
                    auVar160 = vdivps_avx(auVar210,ZEXT1632(auVar127));
                    break;
                  case 5:
                    auVar160 = vminps_avx(auVar160,auVar198);
                    auVar160 = vmaxps_avx(auVar160,auVar201);
                    auVar127 = vfmadd213ps_fma(auVar207,auVar160,auVar204);
                    auVar157 = vrndscaleps_avx512vl(ZEXT1632(auVar127),1);
                    uVar122 = vcmpps_avx512vl(ZEXT1632(auVar127),auVar157,1);
                    auVar158 = vsubps_avx512vl(auVar157,auVar210);
                    bVar27 = (bool)((byte)uVar122 & 1);
                    bVar28 = (bool)((byte)(uVar122 >> 1) & 1);
                    auVar66._4_4_ = (uint)bVar28 * auVar158._4_4_ | (uint)!bVar28 * auVar157._4_4_;
                    auVar66._0_4_ = (uint)bVar27 * auVar158._0_4_ | (uint)!bVar27 * auVar157._0_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 2) & 1);
                    auVar66._8_4_ = (uint)bVar27 * auVar158._8_4_ | (uint)!bVar27 * auVar157._8_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 3) & 1);
                    auVar66._12_4_ =
                         (uint)bVar27 * auVar158._12_4_ | (uint)!bVar27 * auVar157._12_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 4) & 1);
                    auVar66._16_4_ =
                         (uint)bVar27 * auVar158._16_4_ | (uint)!bVar27 * auVar157._16_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 5) & 1);
                    auVar66._20_4_ =
                         (uint)bVar27 * auVar158._20_4_ | (uint)!bVar27 * auVar157._20_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 6) & 1);
                    auVar66._24_4_ =
                         (uint)bVar27 * auVar158._24_4_ | (uint)!bVar27 * auVar157._24_4_;
                    bVar27 = SUB81(uVar122 >> 7,0);
                    auVar66._28_4_ =
                         (uint)bVar27 * auVar158._28_4_ | (uint)!bVar27 * auVar157._28_4_;
                    auVar160 = vfmsub231ps_avx512vl(auVar160,auVar66,auVar213);
                    auVar160 = vfnmsub231ps_avx512vl(auVar160,auVar66,auVar256);
                    auVar241._0_4_ = auVar160._0_4_ * auVar160._0_4_;
                    auVar241._4_4_ = auVar160._4_4_ * auVar160._4_4_;
                    auVar241._8_4_ = auVar160._8_4_ * auVar160._8_4_;
                    auVar241._12_4_ = auVar160._12_4_ * auVar160._12_4_;
                    auVar241._16_4_ = auVar160._16_4_ * auVar160._16_4_;
                    auVar241._20_4_ = auVar160._20_4_ * auVar160._20_4_;
                    auVar241._24_4_ = auVar160._24_4_ * auVar160._24_4_;
                    auVar241._28_4_ = 0;
                    auVar157 = vfmadd213ps_avx512vl(auVar161,auVar160,auVar244);
                    auVar157 = vfmadd213ps_avx512vl(auVar157,auVar160,auVar246);
                    auVar157 = vfmadd213ps_avx512vl(auVar157,auVar160,auVar249);
                    auVar157 = vfmadd213ps_avx512vl(auVar157,auVar160,auVar251);
                    auVar157 = vfmadd213ps_avx512vl(auVar157,auVar160,auVar204);
                    auVar160 = vfmadd213ps_avx512vl(auVar157,auVar241,auVar160);
                    auVar157 = vaddps_avx512vl(auVar160,auVar210);
                    auVar160 = vcvttps2dq_avx512vl(auVar66);
                    auVar160 = vpslld_avx2(auVar160,0x17);
                    auVar160 = vpaddd_avx2(auVar160,auVar253);
                    auVar127 = vfmadd213ps_fma(auVar160,auVar157,auVar210);
                    uVar122 = vcmpps_avx512vl(ZEXT1632(auVar127),auVar159,2);
                    auVar160._8_4_ = 0x800000;
                    auVar160._0_8_ = 0x80000000800000;
                    auVar160._12_4_ = 0x800000;
                    auVar160._16_4_ = 0x800000;
                    auVar160._20_4_ = 0x800000;
                    auVar160._24_4_ = 0x800000;
                    auVar160._28_4_ = 0x800000;
                    auVar160 = vmaxps_avx512vl(ZEXT1632(auVar127),auVar160);
                    auVar158 = vpsrld_avx2(auVar160,0x17);
                    auVar157 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar159._8_4_ = 0x3f000000;
                    auVar159._0_8_ = 0x3f0000003f000000;
                    auVar159._12_4_ = 0x3f000000;
                    auVar159._16_4_ = 0x3f000000;
                    auVar159._20_4_ = 0x3f000000;
                    auVar159._24_4_ = 0x3f000000;
                    auVar159._28_4_ = 0x3f000000;
                    auVar160 = vpternlogd_avx512vl(auVar160,auVar157,auVar159,0xea);
                    uVar112 = vcmpps_avx512vl(auVar160,auVar145,1);
                    auVar159 = vaddps_avx512vl(auVar160,auVar146);
                    auVar160 = vaddps_avx512vl(auVar159,auVar160);
                    bVar27 = (bool)((byte)uVar112 & 1);
                    bVar28 = (bool)((byte)(uVar112 >> 1) & 1);
                    auVar67._4_4_ = (uint)bVar28 * auVar160._4_4_ | (uint)!bVar28 * auVar159._4_4_;
                    auVar67._0_4_ = (uint)bVar27 * auVar160._0_4_ | (uint)!bVar27 * auVar159._0_4_;
                    bVar27 = (bool)((byte)(uVar112 >> 2) & 1);
                    auVar67._8_4_ = (uint)bVar27 * auVar160._8_4_ | (uint)!bVar27 * auVar159._8_4_;
                    bVar27 = (bool)((byte)(uVar112 >> 3) & 1);
                    auVar67._12_4_ =
                         (uint)bVar27 * auVar160._12_4_ | (uint)!bVar27 * auVar159._12_4_;
                    bVar27 = (bool)((byte)(uVar112 >> 4) & 1);
                    auVar67._16_4_ =
                         (uint)bVar27 * auVar160._16_4_ | (uint)!bVar27 * auVar159._16_4_;
                    bVar27 = (bool)((byte)(uVar112 >> 5) & 1);
                    auVar67._20_4_ =
                         (uint)bVar27 * auVar160._20_4_ | (uint)!bVar27 * auVar159._20_4_;
                    bVar27 = (bool)((byte)(uVar112 >> 6) & 1);
                    auVar67._24_4_ =
                         (uint)bVar27 * auVar160._24_4_ | (uint)!bVar27 * auVar159._24_4_;
                    bVar27 = SUB81(uVar112 >> 7,0);
                    auVar67._28_4_ =
                         (uint)bVar27 * auVar160._28_4_ | (uint)!bVar27 * auVar159._28_4_;
                    auVar159 = vmulps_avx512vl(auVar67,auVar67);
                    auVar160 = vfmadd213ps_avx512vl(auVar147,auVar67,auVar148);
                    auVar160 = vfmadd213ps_avx512vl(auVar160,auVar67,auVar149);
                    auVar160 = vfmadd213ps_avx512vl(auVar160,auVar67,auVar150);
                    auVar160 = vfmadd213ps_avx512vl(auVar160,auVar67,auVar151);
                    auVar160 = vfmadd213ps_avx512vl(auVar160,auVar67,auVar152);
                    auVar160 = vfmadd213ps_avx512vl(auVar160,auVar67,auVar153);
                    auVar160 = vfmadd213ps_avx512vl(auVar160,auVar67,auVar154);
                    auVar160 = vfmadd213ps_avx512vl(auVar160,auVar67,auVar155);
                    auVar157 = vmulps_avx512vl(auVar159,auVar67);
                    auVar157 = vmulps_avx512vl(auVar157,auVar160);
                    auVar53._8_4_ = 0xffffff82;
                    auVar53._0_8_ = 0xffffff82ffffff82;
                    auVar53._12_4_ = 0xffffff82;
                    auVar53._16_4_ = 0xffffff82;
                    auVar53._20_4_ = 0xffffff82;
                    auVar53._24_4_ = 0xffffff82;
                    auVar53._28_4_ = 0xffffff82;
                    auVar160 = vpaddd_avx512vl(auVar158,auVar53);
                    auVar160 = vcvtdq2ps_avx(auVar160);
                    auVar158 = vsubps_avx512vl(auVar160,auVar210);
                    bVar27 = (bool)((byte)uVar112 & 1);
                    bVar28 = (bool)((byte)(uVar112 >> 1) & 1);
                    auVar68._4_4_ = (uint)bVar28 * auVar158._4_4_ | (uint)!bVar28 * auVar160._4_4_;
                    auVar68._0_4_ = (uint)bVar27 * auVar158._0_4_ | (uint)!bVar27 * auVar160._0_4_;
                    bVar27 = (bool)((byte)(uVar112 >> 2) & 1);
                    auVar68._8_4_ = (uint)bVar27 * auVar158._8_4_ | (uint)!bVar27 * auVar160._8_4_;
                    bVar27 = (bool)((byte)(uVar112 >> 3) & 1);
                    auVar68._12_4_ =
                         (uint)bVar27 * auVar158._12_4_ | (uint)!bVar27 * auVar160._12_4_;
                    bVar27 = (bool)((byte)(uVar112 >> 4) & 1);
                    auVar68._16_4_ =
                         (uint)bVar27 * auVar158._16_4_ | (uint)!bVar27 * auVar160._16_4_;
                    bVar27 = (bool)((byte)(uVar112 >> 5) & 1);
                    auVar68._20_4_ =
                         (uint)bVar27 * auVar158._20_4_ | (uint)!bVar27 * auVar160._20_4_;
                    bVar27 = (bool)((byte)(uVar112 >> 6) & 1);
                    auVar68._24_4_ =
                         (uint)bVar27 * auVar158._24_4_ | (uint)!bVar27 * auVar160._24_4_;
                    bVar27 = SUB81(uVar112 >> 7,0);
                    auVar68._28_4_ =
                         (uint)bVar27 * auVar158._28_4_ | (uint)!bVar27 * auVar160._28_4_;
                    auVar160 = vfmadd231ps_avx512vl(auVar157,auVar68,auVar256);
                    auVar160 = vfmsub231ps_avx512vl(auVar160,auVar204,auVar159);
                    auVar160 = vsubps_avx512vl(auVar160,auVar67);
                    auVar127 = vfmsub231ps_fma(auVar160,auVar213,auVar68);
                    auVar160 = vmulps_avx512vl(ZEXT1632(auVar127),auVar156);
                    auVar159 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar27 = (bool)((byte)uVar122 & 1);
                    bVar28 = (bool)((byte)(uVar122 >> 1) & 1);
                    auVar69._4_4_ = (uint)bVar28 * auVar159._4_4_ | (uint)!bVar28 * auVar160._4_4_;
                    auVar69._0_4_ = (uint)bVar27 * auVar159._0_4_ | (uint)!bVar27 * auVar160._0_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 2) & 1);
                    auVar69._8_4_ = (uint)bVar27 * auVar159._8_4_ | (uint)!bVar27 * auVar160._8_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 3) & 1);
                    auVar69._12_4_ =
                         (uint)bVar27 * auVar159._12_4_ | (uint)!bVar27 * auVar160._12_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 4) & 1);
                    auVar69._16_4_ =
                         (uint)bVar27 * auVar159._16_4_ | (uint)!bVar27 * auVar160._16_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 5) & 1);
                    auVar69._20_4_ =
                         (uint)bVar27 * auVar159._20_4_ | (uint)!bVar27 * auVar160._20_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 6) & 1);
                    auVar69._24_4_ =
                         (uint)bVar27 * auVar159._24_4_ | (uint)!bVar27 * auVar160._24_4_;
                    bVar27 = SUB81(uVar122 >> 7,0);
                    auVar69._28_4_ =
                         (uint)bVar27 * auVar159._28_4_ | (uint)!bVar27 * auVar160._28_4_;
                    auVar160 = vminps_avx(auVar69,auVar198);
                    auVar160 = vmaxps_avx(auVar160,auVar201);
                    auVar127 = vfmadd213ps_fma(auVar207,auVar160,auVar204);
                    auVar159 = vrndscaleps_avx512vl(ZEXT1632(auVar127),1);
                    uVar122 = vcmpps_avx512vl(ZEXT1632(auVar127),auVar159,1);
                    auVar157 = vsubps_avx512vl(auVar159,auVar210);
                    bVar27 = (bool)((byte)uVar122 & 1);
                    bVar28 = (bool)((byte)(uVar122 >> 1) & 1);
                    auVar70._4_4_ = (uint)bVar28 * auVar157._4_4_ | (uint)!bVar28 * auVar159._4_4_;
                    auVar70._0_4_ = (uint)bVar27 * auVar157._0_4_ | (uint)!bVar27 * auVar159._0_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 2) & 1);
                    auVar70._8_4_ = (uint)bVar27 * auVar157._8_4_ | (uint)!bVar27 * auVar159._8_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 3) & 1);
                    auVar70._12_4_ =
                         (uint)bVar27 * auVar157._12_4_ | (uint)!bVar27 * auVar159._12_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 4) & 1);
                    auVar70._16_4_ =
                         (uint)bVar27 * auVar157._16_4_ | (uint)!bVar27 * auVar159._16_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 5) & 1);
                    auVar70._20_4_ =
                         (uint)bVar27 * auVar157._20_4_ | (uint)!bVar27 * auVar159._20_4_;
                    bVar27 = (bool)((byte)(uVar122 >> 6) & 1);
                    auVar70._24_4_ =
                         (uint)bVar27 * auVar157._24_4_ | (uint)!bVar27 * auVar159._24_4_;
                    bVar27 = SUB81(uVar122 >> 7,0);
                    auVar70._28_4_ =
                         (uint)bVar27 * auVar157._28_4_ | (uint)!bVar27 * auVar159._28_4_;
                    auVar160 = vfmsub231ps_avx512vl(auVar160,auVar70,auVar213);
                    auVar160 = vfnmsub231ps_avx512vl(auVar160,auVar70,auVar256);
                    auVar242._0_4_ = auVar160._0_4_ * auVar160._0_4_;
                    auVar242._4_4_ = auVar160._4_4_ * auVar160._4_4_;
                    auVar242._8_4_ = auVar160._8_4_ * auVar160._8_4_;
                    auVar242._12_4_ = auVar160._12_4_ * auVar160._12_4_;
                    auVar242._16_4_ = auVar160._16_4_ * auVar160._16_4_;
                    auVar242._20_4_ = auVar160._20_4_ * auVar160._20_4_;
                    auVar242._24_4_ = auVar160._24_4_ * auVar160._24_4_;
                    auVar242._28_4_ = 0;
                    auVar159 = vfmadd213ps_avx512vl(auVar161,auVar160,auVar244);
                    auVar159 = vfmadd213ps_avx512vl(auVar159,auVar160,auVar246);
                    auVar159 = vfmadd213ps_avx512vl(auVar159,auVar160,auVar249);
                    auVar159 = vfmadd213ps_avx512vl(auVar159,auVar160,auVar251);
                    auVar159 = vfmadd213ps_avx512vl(auVar159,auVar160,auVar204);
                    auVar160 = vfmadd213ps_avx512vl(auVar159,auVar242,auVar160);
                    auVar159 = vaddps_avx512vl(auVar160,auVar210);
                    auVar160 = vcvttps2dq_avx512vl(auVar70);
                    auVar160 = vpslld_avx2(auVar160,0x17);
                    auVar160 = vpaddd_avx2(auVar160,auVar253);
                    auVar127 = vfmadd213ps_fma(auVar160,auVar159,auVar210);
                    auVar160 = vdivps_avx(auVar210,ZEXT1632(auVar127));
                    auVar160 = vfnmadd213ps_avx512vl(auVar160,auVar156,auVar146);
                    auVar144 = auVar160._0_28_;
                    goto LAB_00433b3b;
                  case 6:
                    puVar22 = (undefined4 *)
                              (this->super_DeconvolutionDepthWise).activation_params.data;
                    uVar1 = *puVar22;
                    auVar158._4_4_ = uVar1;
                    auVar158._0_4_ = uVar1;
                    auVar158._8_4_ = uVar1;
                    auVar158._12_4_ = uVar1;
                    auVar158._16_4_ = uVar1;
                    auVar158._20_4_ = uVar1;
                    auVar158._24_4_ = uVar1;
                    auVar158._28_4_ = uVar1;
                    uVar1 = puVar22[1];
                    auVar157._4_4_ = uVar1;
                    auVar157._0_4_ = uVar1;
                    auVar157._8_4_ = uVar1;
                    auVar157._12_4_ = uVar1;
                    auVar157._16_4_ = uVar1;
                    auVar157._20_4_ = uVar1;
                    auVar157._24_4_ = uVar1;
                    auVar157._28_4_ = uVar1;
                    auVar160 = vfmadd213ps_avx512vl(auVar158,auVar160,auVar157);
                    auVar160 = vmaxps_avx(auVar160,auVar159);
                    auVar160 = vminps_avx(auVar160,auVar210);
                    auVar144 = auVar160._0_28_;
LAB_00433b3b:
                    auVar196._0_4_ = auVar144._0_4_ * auVar195._0_4_;
                    auVar196._4_4_ = auVar144._4_4_ * auVar195._4_4_;
                    auVar196._8_4_ = auVar144._8_4_ * auVar195._8_4_;
                    auVar196._12_4_ = auVar144._12_4_ * auVar195._12_4_;
                    auVar196._16_4_ = auVar144._16_4_ * auVar195._16_4_;
                    auVar196._20_4_ = auVar144._20_4_ * auVar195._20_4_;
                    auVar196._28_36_ = auVar195._28_36_;
                    auVar196._24_4_ = auVar144._24_4_ * auVar195._24_4_;
                    auVar160 = auVar196._0_32_;
                  }
LAB_00433b4a:
                  *pauVar116 = auVar160;
                  pauVar116 = pauVar116 + 1;
                  iVar110 = iVar110 + 1;
                  local_374 = local_374 + 1;
                } while (iVar110 != _w);
              }
              iVar106 = iVar106 + 1;
            } while (iVar106 != _h);
          }
          uVar122 = local_b8._0_8_ + 1;
          local_b8._0_8_ = uVar122;
        } while (uVar122 != uVar109);
      }
    }
    else if ((iVar113 == 0x10) && (0 < (int)uVar15)) {
      uVar17 = vpcmpd_avx512vl((undefined1  [16])0x0,local_1d8,1);
      uVar122 = (uVar17 & 0xf) >> 1;
      local_b8._0_4_ = (int)uVar122;
      auVar195 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar196 = vxorps_avx512dq(auVar195,(undefined1  [64])_ps512_cephes_log_q2);
      auVar254 = vxorps_avx512dq(auVar195,(undefined1  [64])_ps512_cephes_log_q1);
      auVar257 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar258 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar195);
      local_358 = 0;
      auVar127 = vxorps_avx512vl(auVar127,auVar127);
      auVar247 = ZEXT1664(auVar127);
      auVar259 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar260 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        if ((uVar122 & 1) != 0) {
          pvVar19 = (this->weight_data_tm).data;
          sVar120 = bottom_blob->cstep;
          sVar20 = bottom_blob->elemsize;
          pvVar21 = bottom_blob->data;
          iVar113 = bottom_blob->w;
          pauVar115 = (undefined1 (*) [64])
                      (local_298.cstep * local_358 * local_298.elemsize + (long)local_298.data);
          iVar106 = 0;
          do {
            if ((uVar17 & 1) != 0) {
              iVar110 = 0;
              local_374 = -local_1e8._0_4_;
              do {
                if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                  auVar205 = ZEXT1664((undefined1  [16])0x0);
                }
                else {
                  auVar205 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((long)(this->super_DeconvolutionDepthWise).
                                                       bias_data.data + local_358 * 0x40));
                }
                iVar16 = (this->super_DeconvolutionDepthWise).kernel_h;
                if (0 < iVar16) {
                  iVar108 = (this->super_DeconvolutionDepthWise).stride_h;
                  uVar111 = (this->super_DeconvolutionDepthWise).kernel_w;
                  iVar117 = (this->super_DeconvolutionDepthWise).stride_w;
                  uVar112 = 0;
                  lVar121 = 0;
                  do {
                    iVar103 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar121 +
                              (iVar106 - local_1e8._4_4_);
                    if ((((-1 < iVar103) && (iVar104 = iVar103 / iVar108, iVar103 % iVar108 == 0))
                        && (iVar104 < iStack_244)) && (0 < (int)uVar111)) {
                      uVar119 = (ulong)uVar111;
                      uVar124 = uVar112;
                      iVar103 = local_374;
                      do {
                        if ((-1 < iVar103) &&
                           (iVar105 = iVar103 / iVar117,
                           iVar105 < local_248 && iVar103 % iVar117 == 0)) {
                          auVar205 = vfmadd231ps_avx512f(auVar205,*(undefined1 (*) [64])
                                                                   ((long)pvVar21 +
                                                                   (long)(iVar105 << 4) * 4 +
                                                                   (long)iVar104 *
                                                                   (long)iVar113 * sVar20 +
                                                                   sVar120 * local_358 * sVar20),
                                                         *(undefined1 (*) [64])
                                                          ((long)pvVar19 +
                                                          (uVar124 & 0xffffffff) * 4 +
                                                          (long)(iVar102 * 0x10 * (int)local_358) *
                                                          4));
                        }
                        iVar103 = iVar103 + (this->super_DeconvolutionDepthWise).dilation_w;
                        uVar124 = uVar124 + 0x10;
                        uVar119 = uVar119 - 1;
                      } while (uVar119 != 0);
                    }
                    lVar121 = lVar121 + 1;
                    uVar112 = uVar112 + (ulong)uVar111 * 0x10;
                  } while (lVar121 != iVar16);
                }
                switch((this->super_DeconvolutionDepthWise).activation_type) {
                case 1:
                  auVar205 = vmaxps_avx512f(auVar205,auVar247);
                  break;
                case 2:
                  uVar112 = vcmpps_avx512f(auVar205,auVar247,1);
                  uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                  auVar59._4_4_ = uVar1;
                  auVar59._0_4_ = uVar1;
                  auVar59._8_4_ = uVar1;
                  auVar59._12_4_ = uVar1;
                  auVar59._16_4_ = uVar1;
                  auVar59._20_4_ = uVar1;
                  auVar59._24_4_ = uVar1;
                  auVar59._28_4_ = uVar1;
                  auVar59._32_4_ = uVar1;
                  auVar59._36_4_ = uVar1;
                  auVar59._40_4_ = uVar1;
                  auVar59._44_4_ = uVar1;
                  auVar59._48_4_ = uVar1;
                  auVar59._52_4_ = uVar1;
                  auVar59._56_4_ = uVar1;
                  auVar59._60_4_ = uVar1;
                  auVar202 = vmulps_avx512f(auVar205,auVar59);
                  bVar27 = (bool)((byte)uVar112 & 1);
                  bVar28 = (bool)((byte)(uVar112 >> 1) & 1);
                  auVar74._4_4_ = (uint)bVar28 * auVar202._4_4_ | (uint)!bVar28 * auVar205._4_4_;
                  auVar74._0_4_ = (uint)bVar27 * auVar202._0_4_ | (uint)!bVar27 * auVar205._0_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 2) & 1);
                  auVar74._8_4_ = (uint)bVar27 * auVar202._8_4_ | (uint)!bVar27 * auVar205._8_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 3) & 1);
                  auVar74._12_4_ = (uint)bVar27 * auVar202._12_4_ | (uint)!bVar27 * auVar205._12_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 4) & 1);
                  auVar74._16_4_ = (uint)bVar27 * auVar202._16_4_ | (uint)!bVar27 * auVar205._16_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 5) & 1);
                  auVar74._20_4_ = (uint)bVar27 * auVar202._20_4_ | (uint)!bVar27 * auVar205._20_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 6) & 1);
                  auVar74._24_4_ = (uint)bVar27 * auVar202._24_4_ | (uint)!bVar27 * auVar205._24_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 7) & 1);
                  auVar74._28_4_ = (uint)bVar27 * auVar202._28_4_ | (uint)!bVar27 * auVar205._28_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 8) & 1);
                  auVar74._32_4_ = (uint)bVar27 * auVar202._32_4_ | (uint)!bVar27 * auVar205._32_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 9) & 1);
                  auVar74._36_4_ = (uint)bVar27 * auVar202._36_4_ | (uint)!bVar27 * auVar205._36_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 10) & 1);
                  auVar74._40_4_ = (uint)bVar27 * auVar202._40_4_ | (uint)!bVar27 * auVar205._40_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xb) & 1);
                  auVar74._44_4_ = (uint)bVar27 * auVar202._44_4_ | (uint)!bVar27 * auVar205._44_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xc) & 1);
                  auVar74._48_4_ = (uint)bVar27 * auVar202._48_4_ | (uint)!bVar27 * auVar205._48_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xd) & 1);
                  auVar74._52_4_ = (uint)bVar27 * auVar202._52_4_ | (uint)!bVar27 * auVar205._52_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xe) & 1);
                  auVar74._56_4_ = (uint)bVar27 * auVar202._56_4_ | (uint)!bVar27 * auVar205._56_4_;
                  bVar27 = SUB81(uVar112 >> 0xf,0);
                  auVar74._60_4_ = (uint)bVar27 * auVar202._60_4_ | (uint)!bVar27 * auVar205._60_4_;
                  auVar205 = auVar74;
                  break;
                case 3:
                  puVar22 = (undefined4 *)
                            (this->super_DeconvolutionDepthWise).activation_params.data;
                  uVar1 = *puVar22;
                  auVar75._4_4_ = uVar1;
                  auVar75._0_4_ = uVar1;
                  auVar75._8_4_ = uVar1;
                  auVar75._12_4_ = uVar1;
                  auVar75._16_4_ = uVar1;
                  auVar75._20_4_ = uVar1;
                  auVar75._24_4_ = uVar1;
                  auVar75._28_4_ = uVar1;
                  auVar75._32_4_ = uVar1;
                  auVar75._36_4_ = uVar1;
                  auVar75._40_4_ = uVar1;
                  auVar75._44_4_ = uVar1;
                  auVar75._48_4_ = uVar1;
                  auVar75._52_4_ = uVar1;
                  auVar75._56_4_ = uVar1;
                  auVar75._60_4_ = uVar1;
                  auVar202 = vmaxps_avx512f(auVar205,auVar75);
                  uVar1 = puVar22[1];
                  auVar205._4_4_ = uVar1;
                  auVar205._0_4_ = uVar1;
                  auVar205._8_4_ = uVar1;
                  auVar205._12_4_ = uVar1;
                  auVar205._16_4_ = uVar1;
                  auVar205._20_4_ = uVar1;
                  auVar205._24_4_ = uVar1;
                  auVar205._28_4_ = uVar1;
                  auVar205._32_4_ = uVar1;
                  auVar205._36_4_ = uVar1;
                  auVar205._40_4_ = uVar1;
                  auVar205._44_4_ = uVar1;
                  auVar205._48_4_ = uVar1;
                  auVar205._52_4_ = uVar1;
                  auVar205._56_4_ = uVar1;
                  auVar205._60_4_ = uVar1;
                  auVar205 = vminps_avx512f(auVar202,auVar205);
                  break;
                case 4:
                  auVar205 = vxorps_avx512dq(auVar205,auVar195);
                  auVar205 = vminps_avx512f(auVar205,(undefined1  [64])afVar83);
                  auVar205 = vmaxps_avx512f(auVar205,(undefined1  [64])afVar84);
                  auVar202 = vfmadd213ps_avx512f((undefined1  [64])afVar85,auVar205,
                                                 (undefined1  [64])afVar91);
                  auVar75 = vrndscaleps_avx512f(auVar202,1);
                  uVar112 = vcmpps_avx512f(auVar202,auVar75,1);
                  auVar202 = vsubps_avx512f(auVar75,(undefined1  [64])afVar82);
                  bVar27 = (bool)((byte)uVar112 & 1);
                  bVar28 = (bool)((byte)(uVar112 >> 1) & 1);
                  auVar73._4_4_ = (uint)bVar28 * auVar202._4_4_ | (uint)!bVar28 * auVar75._4_4_;
                  auVar73._0_4_ = (uint)bVar27 * auVar202._0_4_ | (uint)!bVar27 * auVar75._0_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 2) & 1);
                  auVar73._8_4_ = (uint)bVar27 * auVar202._8_4_ | (uint)!bVar27 * auVar75._8_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 3) & 1);
                  auVar73._12_4_ = (uint)bVar27 * auVar202._12_4_ | (uint)!bVar27 * auVar75._12_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 4) & 1);
                  auVar73._16_4_ = (uint)bVar27 * auVar202._16_4_ | (uint)!bVar27 * auVar75._16_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 5) & 1);
                  auVar73._20_4_ = (uint)bVar27 * auVar202._20_4_ | (uint)!bVar27 * auVar75._20_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 6) & 1);
                  auVar73._24_4_ = (uint)bVar27 * auVar202._24_4_ | (uint)!bVar27 * auVar75._24_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 7) & 1);
                  auVar73._28_4_ = (uint)bVar27 * auVar202._28_4_ | (uint)!bVar27 * auVar75._28_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 8) & 1);
                  auVar73._32_4_ = (uint)bVar27 * auVar202._32_4_ | (uint)!bVar27 * auVar75._32_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 9) & 1);
                  auVar73._36_4_ = (uint)bVar27 * auVar202._36_4_ | (uint)!bVar27 * auVar75._36_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 10) & 1);
                  auVar73._40_4_ = (uint)bVar27 * auVar202._40_4_ | (uint)!bVar27 * auVar75._40_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xb) & 1);
                  auVar73._44_4_ = (uint)bVar27 * auVar202._44_4_ | (uint)!bVar27 * auVar75._44_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xc) & 1);
                  auVar73._48_4_ = (uint)bVar27 * auVar202._48_4_ | (uint)!bVar27 * auVar75._48_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xd) & 1);
                  auVar73._52_4_ = (uint)bVar27 * auVar202._52_4_ | (uint)!bVar27 * auVar75._52_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xe) & 1);
                  auVar73._56_4_ = (uint)bVar27 * auVar202._56_4_ | (uint)!bVar27 * auVar75._56_4_;
                  bVar27 = SUB81(uVar112 >> 0xf,0);
                  auVar73._60_4_ = (uint)bVar27 * auVar202._60_4_ | (uint)!bVar27 * auVar75._60_4_;
                  auVar205 = vfmadd231ps_avx512f(auVar205,auVar73,auVar196);
                  auVar205 = vfmadd231ps_avx512f(auVar205,auVar73,auVar254);
                  auVar202 = vmulps_avx512f(auVar205,auVar205);
                  auVar75 = vfmadd213ps_avx512f(auVar205,(undefined1  [64])afVar86,
                                                (undefined1  [64])afVar87);
                  auVar75 = vfmadd213ps_avx512f(auVar75,auVar205,(undefined1  [64])afVar88);
                  auVar75 = vfmadd213ps_avx512f(auVar75,auVar205,(undefined1  [64])afVar89);
                  auVar75 = vfmadd213ps_avx512f(auVar75,auVar205,(undefined1  [64])afVar90);
                  auVar75 = vfmadd213ps_avx512f(auVar75,auVar205,(undefined1  [64])afVar91);
                  auVar205 = vfmadd213ps_avx512f(auVar75,auVar202,auVar205);
                  auVar205 = vaddps_avx512f(auVar205,(undefined1  [64])afVar82);
                  auVar202 = vcvttps2dq_avx512f(auVar73);
                  auVar202 = vpaddd_avx512f(auVar257,auVar202);
                  auVar202 = vpslld_avx512f(auVar202,0x17);
                  auVar205 = vfmadd213ps_avx512f(auVar202,auVar205,auVar259);
                  auVar205 = vdivps_avx512f(auVar259,auVar205);
                  break;
                case 5:
                  auVar202 = vminps_avx512f(auVar205,(undefined1  [64])afVar83);
                  auVar202 = vmaxps_avx512f(auVar202,(undefined1  [64])afVar84);
                  auVar75 = vfmadd213ps_avx512f((undefined1  [64])afVar85,auVar202,
                                                (undefined1  [64])afVar91);
                  auVar76 = vrndscaleps_avx512f(auVar75,1);
                  uVar112 = vcmpps_avx512f(auVar75,auVar76,1);
                  auVar75 = vsubps_avx512f(auVar76,(undefined1  [64])afVar82);
                  bVar27 = (bool)((byte)uVar112 & 1);
                  bVar28 = (bool)((byte)(uVar112 >> 1) & 1);
                  auVar208._4_4_ = (uint)bVar28 * auVar75._4_4_ | (uint)!bVar28 * auVar76._4_4_;
                  auVar208._0_4_ = (uint)bVar27 * auVar75._0_4_ | (uint)!bVar27 * auVar76._0_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 2) & 1);
                  auVar208._8_4_ = (uint)bVar27 * auVar75._8_4_ | (uint)!bVar27 * auVar76._8_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 3) & 1);
                  auVar208._12_4_ = (uint)bVar27 * auVar75._12_4_ | (uint)!bVar27 * auVar76._12_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 4) & 1);
                  auVar208._16_4_ = (uint)bVar27 * auVar75._16_4_ | (uint)!bVar27 * auVar76._16_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 5) & 1);
                  auVar208._20_4_ = (uint)bVar27 * auVar75._20_4_ | (uint)!bVar27 * auVar76._20_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 6) & 1);
                  auVar208._24_4_ = (uint)bVar27 * auVar75._24_4_ | (uint)!bVar27 * auVar76._24_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 7) & 1);
                  auVar208._28_4_ = (uint)bVar27 * auVar75._28_4_ | (uint)!bVar27 * auVar76._28_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 8) & 1);
                  auVar208._32_4_ = (uint)bVar27 * auVar75._32_4_ | (uint)!bVar27 * auVar76._32_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 9) & 1);
                  auVar208._36_4_ = (uint)bVar27 * auVar75._36_4_ | (uint)!bVar27 * auVar76._36_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 10) & 1);
                  auVar208._40_4_ = (uint)bVar27 * auVar75._40_4_ | (uint)!bVar27 * auVar76._40_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xb) & 1);
                  auVar208._44_4_ = (uint)bVar27 * auVar75._44_4_ | (uint)!bVar27 * auVar76._44_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xc) & 1);
                  auVar208._48_4_ = (uint)bVar27 * auVar75._48_4_ | (uint)!bVar27 * auVar76._48_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xd) & 1);
                  auVar208._52_4_ = (uint)bVar27 * auVar75._52_4_ | (uint)!bVar27 * auVar76._52_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xe) & 1);
                  auVar208._56_4_ = (uint)bVar27 * auVar75._56_4_ | (uint)!bVar27 * auVar76._56_4_;
                  bVar27 = SUB81(uVar112 >> 0xf,0);
                  auVar208._60_4_ = (uint)bVar27 * auVar75._60_4_ | (uint)!bVar27 * auVar76._60_4_;
                  auVar202 = vfmadd231ps_avx512f(auVar202,auVar208,auVar196);
                  auVar202 = vfmadd231ps_avx512f(auVar202,auVar208,auVar254);
                  auVar75 = vmulps_avx512f(auVar202,auVar202);
                  auVar76 = vfmadd213ps_avx512f(auVar202,(undefined1  [64])afVar86,
                                                (undefined1  [64])afVar87);
                  auVar76 = vfmadd213ps_avx512f(auVar76,auVar202,(undefined1  [64])afVar88);
                  auVar76 = vfmadd213ps_avx512f(auVar76,auVar202,(undefined1  [64])afVar89);
                  auVar76 = vfmadd213ps_avx512f(auVar76,auVar202,(undefined1  [64])afVar90);
                  auVar76 = vfmadd213ps_avx512f(auVar76,auVar202,(undefined1  [64])afVar91);
                  auVar202 = vfmadd213ps_avx512f(auVar76,auVar75,auVar202);
                  auVar202 = vaddps_avx512f(auVar202,(undefined1  [64])afVar82);
                  auVar75 = vcvttps2dq_avx512f(auVar208);
                  auVar75 = vpaddd_avx512f(auVar257,auVar75);
                  auVar75 = vpslld_avx512f(auVar75,0x17);
                  auVar202 = vfmadd213ps_avx512f(auVar75,auVar202,auVar259);
                  auVar75 = vmaxps_avx512f(auVar202,(undefined1  [64])_ps512_min_norm_pos);
                  auVar76 = vpsrld_avx512f(auVar75,0x17);
                  auVar75 = vpternlogd_avx512f(auVar75,(undefined1  [64])afVar91,
                                               (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar112 = vcmpps_avx512f(auVar75,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar208 = vsubps_avx512f(auVar75,(undefined1  [64])afVar82);
                  auVar75 = vaddps_avx512f(auVar208,auVar75);
                  bVar27 = (bool)((byte)uVar112 & 1);
                  bVar28 = (bool)((byte)(uVar112 >> 1) & 1);
                  auVar211._4_4_ = (uint)bVar28 * auVar75._4_4_ | (uint)!bVar28 * auVar208._4_4_;
                  auVar211._0_4_ = (uint)bVar27 * auVar75._0_4_ | (uint)!bVar27 * auVar208._0_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 2) & 1);
                  auVar211._8_4_ = (uint)bVar27 * auVar75._8_4_ | (uint)!bVar27 * auVar208._8_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 3) & 1);
                  auVar211._12_4_ = (uint)bVar27 * auVar75._12_4_ | (uint)!bVar27 * auVar208._12_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 4) & 1);
                  auVar211._16_4_ = (uint)bVar27 * auVar75._16_4_ | (uint)!bVar27 * auVar208._16_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 5) & 1);
                  auVar211._20_4_ = (uint)bVar27 * auVar75._20_4_ | (uint)!bVar27 * auVar208._20_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 6) & 1);
                  auVar211._24_4_ = (uint)bVar27 * auVar75._24_4_ | (uint)!bVar27 * auVar208._24_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 7) & 1);
                  auVar211._28_4_ = (uint)bVar27 * auVar75._28_4_ | (uint)!bVar27 * auVar208._28_4_;
                  bVar35 = (byte)(uVar112 >> 8);
                  bVar27 = (bool)(bVar35 & 1);
                  auVar211._32_4_ = (uint)bVar27 * auVar75._32_4_ | (uint)!bVar27 * auVar208._32_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 9) & 1);
                  auVar211._36_4_ = (uint)bVar27 * auVar75._36_4_ | (uint)!bVar27 * auVar208._36_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 10) & 1);
                  auVar211._40_4_ = (uint)bVar27 * auVar75._40_4_ | (uint)!bVar27 * auVar208._40_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xb) & 1);
                  auVar211._44_4_ = (uint)bVar27 * auVar75._44_4_ | (uint)!bVar27 * auVar208._44_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xc) & 1);
                  auVar211._48_4_ = (uint)bVar27 * auVar75._48_4_ | (uint)!bVar27 * auVar208._48_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xd) & 1);
                  auVar211._52_4_ = (uint)bVar27 * auVar75._52_4_ | (uint)!bVar27 * auVar208._52_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xe) & 1);
                  auVar211._56_4_ = (uint)bVar27 * auVar75._56_4_ | (uint)!bVar27 * auVar208._56_4_;
                  bVar27 = SUB81(uVar112 >> 0xf,0);
                  auVar211._60_4_ = (uint)bVar27 * auVar75._60_4_ | (uint)!bVar27 * auVar208._60_4_;
                  auVar75 = vmulps_avx512f(auVar211,auVar211);
                  auVar208 = vfmadd132ps_avx512f(auVar211,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar208 = vfmadd213ps_avx512f(auVar208,auVar211,(undefined1  [64])afVar92);
                  auVar208 = vfmadd213ps_avx512f(auVar208,auVar211,(undefined1  [64])afVar93);
                  auVar208 = vfmadd213ps_avx512f(auVar208,auVar211,(undefined1  [64])afVar94);
                  auVar208 = vfmadd213ps_avx512f(auVar208,auVar211,(undefined1  [64])afVar95);
                  auVar208 = vfmadd213ps_avx512f(auVar208,auVar211,(undefined1  [64])afVar96);
                  auVar208 = vfmadd213ps_avx512f(auVar208,auVar211,(undefined1  [64])afVar97);
                  auVar208 = vfmadd213ps_avx512f(auVar208,auVar211,(undefined1  [64])afVar98);
                  auVar77 = vmulps_avx512f(auVar75,auVar211);
                  auVar208 = vfmadd213ps_avx512f(auVar77,auVar208,auVar211);
                  uVar119 = vcmpps_avx512f(auVar202,auVar247,2);
                  auVar202 = vpsubd_avx512f(auVar76,auVar257);
                  auVar202 = vcvtdq2ps_avx512f(auVar202);
                  auVar76 = vaddps_avx512f(auVar202,(undefined1  [64])afVar82);
                  bVar27 = (bool)((byte)uVar112 & 1);
                  bVar28 = (bool)((byte)(uVar112 >> 1) & 1);
                  auVar77._4_4_ = (uint)bVar28 * auVar202._4_4_ | (uint)!bVar28 * auVar76._4_4_;
                  auVar77._0_4_ = (uint)bVar27 * auVar202._0_4_ | (uint)!bVar27 * auVar76._0_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 2) & 1);
                  auVar77._8_4_ = (uint)bVar27 * auVar202._8_4_ | (uint)!bVar27 * auVar76._8_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 3) & 1);
                  auVar77._12_4_ = (uint)bVar27 * auVar202._12_4_ | (uint)!bVar27 * auVar76._12_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 4) & 1);
                  auVar77._16_4_ = (uint)bVar27 * auVar202._16_4_ | (uint)!bVar27 * auVar76._16_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 5) & 1);
                  auVar77._20_4_ = (uint)bVar27 * auVar202._20_4_ | (uint)!bVar27 * auVar76._20_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 6) & 1);
                  auVar77._24_4_ = (uint)bVar27 * auVar202._24_4_ | (uint)!bVar27 * auVar76._24_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 7) & 1);
                  auVar77._28_4_ = (uint)bVar27 * auVar202._28_4_ | (uint)!bVar27 * auVar76._28_4_;
                  bVar27 = (bool)(bVar35 & 1);
                  auVar77._32_4_ = (uint)bVar27 * auVar202._32_4_ | (uint)!bVar27 * auVar76._32_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 9) & 1);
                  auVar77._36_4_ = (uint)bVar27 * auVar202._36_4_ | (uint)!bVar27 * auVar76._36_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 10) & 1);
                  auVar77._40_4_ = (uint)bVar27 * auVar202._40_4_ | (uint)!bVar27 * auVar76._40_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xb) & 1);
                  auVar77._44_4_ = (uint)bVar27 * auVar202._44_4_ | (uint)!bVar27 * auVar76._44_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xc) & 1);
                  auVar77._48_4_ = (uint)bVar27 * auVar202._48_4_ | (uint)!bVar27 * auVar76._48_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xd) & 1);
                  auVar77._52_4_ = (uint)bVar27 * auVar202._52_4_ | (uint)!bVar27 * auVar76._52_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xe) & 1);
                  auVar77._56_4_ = (uint)bVar27 * auVar202._56_4_ | (uint)!bVar27 * auVar76._56_4_;
                  bVar27 = SUB81(uVar112 >> 0xf,0);
                  auVar77._60_4_ = (uint)bVar27 * auVar202._60_4_ | (uint)!bVar27 * auVar76._60_4_;
                  auVar202 = vfmadd231ps_avx512f(auVar208,auVar77,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar202 = vfmadd231ps_avx512f(auVar202,auVar258,auVar75);
                  auVar202 = vfmadd231ps_avx512f(auVar202,auVar77,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar202 = vmulps_avx512f(auVar202,auVar260);
                  auVar75 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar27 = (bool)((byte)uVar119 & 1);
                  bVar28 = (bool)((byte)(uVar119 >> 1) & 1);
                  auVar76._4_4_ = (uint)bVar28 * auVar75._4_4_ | (uint)!bVar28 * auVar202._4_4_;
                  auVar76._0_4_ = (uint)bVar27 * auVar75._0_4_ | (uint)!bVar27 * auVar202._0_4_;
                  bVar27 = (bool)((byte)(uVar119 >> 2) & 1);
                  auVar76._8_4_ = (uint)bVar27 * auVar75._8_4_ | (uint)!bVar27 * auVar202._8_4_;
                  bVar27 = (bool)((byte)(uVar119 >> 3) & 1);
                  auVar76._12_4_ = (uint)bVar27 * auVar75._12_4_ | (uint)!bVar27 * auVar202._12_4_;
                  bVar27 = (bool)((byte)(uVar119 >> 4) & 1);
                  auVar76._16_4_ = (uint)bVar27 * auVar75._16_4_ | (uint)!bVar27 * auVar202._16_4_;
                  bVar27 = (bool)((byte)(uVar119 >> 5) & 1);
                  auVar76._20_4_ = (uint)bVar27 * auVar75._20_4_ | (uint)!bVar27 * auVar202._20_4_;
                  bVar27 = (bool)((byte)(uVar119 >> 6) & 1);
                  auVar76._24_4_ = (uint)bVar27 * auVar75._24_4_ | (uint)!bVar27 * auVar202._24_4_;
                  bVar27 = (bool)((byte)(uVar119 >> 7) & 1);
                  auVar76._28_4_ = (uint)bVar27 * auVar75._28_4_ | (uint)!bVar27 * auVar202._28_4_;
                  bVar27 = (bool)((byte)(uVar119 >> 8) & 1);
                  auVar76._32_4_ = (uint)bVar27 * auVar75._32_4_ | (uint)!bVar27 * auVar202._32_4_;
                  bVar27 = (bool)((byte)(uVar119 >> 9) & 1);
                  auVar76._36_4_ = (uint)bVar27 * auVar75._36_4_ | (uint)!bVar27 * auVar202._36_4_;
                  bVar27 = (bool)((byte)(uVar119 >> 10) & 1);
                  auVar76._40_4_ = (uint)bVar27 * auVar75._40_4_ | (uint)!bVar27 * auVar202._40_4_;
                  bVar27 = (bool)((byte)(uVar119 >> 0xb) & 1);
                  auVar76._44_4_ = (uint)bVar27 * auVar75._44_4_ | (uint)!bVar27 * auVar202._44_4_;
                  bVar27 = (bool)((byte)(uVar119 >> 0xc) & 1);
                  auVar76._48_4_ = (uint)bVar27 * auVar75._48_4_ | (uint)!bVar27 * auVar202._48_4_;
                  bVar27 = (bool)((byte)(uVar119 >> 0xd) & 1);
                  auVar76._52_4_ = (uint)bVar27 * auVar75._52_4_ | (uint)!bVar27 * auVar202._52_4_;
                  bVar27 = (bool)((byte)(uVar119 >> 0xe) & 1);
                  auVar76._56_4_ = (uint)bVar27 * auVar75._56_4_ | (uint)!bVar27 * auVar202._56_4_;
                  bVar27 = SUB81(uVar119 >> 0xf,0);
                  auVar76._60_4_ = (uint)bVar27 * auVar75._60_4_ | (uint)!bVar27 * auVar202._60_4_;
                  auVar202 = vminps_avx512f(auVar76,(undefined1  [64])afVar83);
                  auVar202 = vmaxps_avx512f(auVar202,(undefined1  [64])afVar84);
                  auVar75 = vfmadd213ps_avx512f((undefined1  [64])afVar85,auVar202,
                                                (undefined1  [64])afVar91);
                  auVar76 = vrndscaleps_avx512f(auVar75,1);
                  uVar112 = vcmpps_avx512f(auVar75,auVar76,1);
                  auVar75 = vsubps_avx512f(auVar76,(undefined1  [64])afVar82);
                  bVar27 = (bool)((byte)uVar112 & 1);
                  bVar28 = (bool)((byte)(uVar112 >> 1) & 1);
                  auVar78._4_4_ = (uint)bVar28 * auVar75._4_4_ | (uint)!bVar28 * auVar76._4_4_;
                  auVar78._0_4_ = (uint)bVar27 * auVar75._0_4_ | (uint)!bVar27 * auVar76._0_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 2) & 1);
                  auVar78._8_4_ = (uint)bVar27 * auVar75._8_4_ | (uint)!bVar27 * auVar76._8_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 3) & 1);
                  auVar78._12_4_ = (uint)bVar27 * auVar75._12_4_ | (uint)!bVar27 * auVar76._12_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 4) & 1);
                  auVar78._16_4_ = (uint)bVar27 * auVar75._16_4_ | (uint)!bVar27 * auVar76._16_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 5) & 1);
                  auVar78._20_4_ = (uint)bVar27 * auVar75._20_4_ | (uint)!bVar27 * auVar76._20_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 6) & 1);
                  auVar78._24_4_ = (uint)bVar27 * auVar75._24_4_ | (uint)!bVar27 * auVar76._24_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 7) & 1);
                  auVar78._28_4_ = (uint)bVar27 * auVar75._28_4_ | (uint)!bVar27 * auVar76._28_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 8) & 1);
                  auVar78._32_4_ = (uint)bVar27 * auVar75._32_4_ | (uint)!bVar27 * auVar76._32_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 9) & 1);
                  auVar78._36_4_ = (uint)bVar27 * auVar75._36_4_ | (uint)!bVar27 * auVar76._36_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 10) & 1);
                  auVar78._40_4_ = (uint)bVar27 * auVar75._40_4_ | (uint)!bVar27 * auVar76._40_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xb) & 1);
                  auVar78._44_4_ = (uint)bVar27 * auVar75._44_4_ | (uint)!bVar27 * auVar76._44_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xc) & 1);
                  auVar78._48_4_ = (uint)bVar27 * auVar75._48_4_ | (uint)!bVar27 * auVar76._48_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xd) & 1);
                  auVar78._52_4_ = (uint)bVar27 * auVar75._52_4_ | (uint)!bVar27 * auVar76._52_4_;
                  bVar27 = (bool)((byte)(uVar112 >> 0xe) & 1);
                  auVar78._56_4_ = (uint)bVar27 * auVar75._56_4_ | (uint)!bVar27 * auVar76._56_4_;
                  bVar27 = SUB81(uVar112 >> 0xf,0);
                  auVar78._60_4_ = (uint)bVar27 * auVar75._60_4_ | (uint)!bVar27 * auVar76._60_4_;
                  auVar202 = vfmadd231ps_avx512f(auVar202,auVar78,auVar196);
                  auVar202 = vfmadd231ps_avx512f(auVar202,auVar78,auVar254);
                  auVar75 = vmulps_avx512f(auVar202,auVar202);
                  auVar76 = vfmadd213ps_avx512f(auVar202,(undefined1  [64])afVar86,
                                                (undefined1  [64])afVar87);
                  auVar76 = vfmadd213ps_avx512f(auVar76,auVar202,(undefined1  [64])afVar88);
                  auVar76 = vfmadd213ps_avx512f(auVar76,auVar202,(undefined1  [64])afVar89);
                  auVar76 = vfmadd213ps_avx512f(auVar76,auVar202,(undefined1  [64])afVar90);
                  auVar76 = vfmadd213ps_avx512f(auVar76,auVar202,(undefined1  [64])afVar91);
                  auVar202 = vfmadd213ps_avx512f(auVar76,auVar75,auVar202);
                  auVar202 = vaddps_avx512f(auVar202,(undefined1  [64])afVar82);
                  auVar75 = vcvttps2dq_avx512f(auVar78);
                  auVar75 = vpaddd_avx512f(auVar75,auVar257);
                  auVar75 = vpslld_avx512f(auVar75,0x17);
                  auVar202 = vfmadd213ps_avx512f(auVar75,auVar202,auVar259);
                  auVar202 = vdivps_avx512f(auVar259,auVar202);
                  auVar202 = vfnmsub213ps_avx512f(auVar202,auVar260,auVar259);
                  goto LAB_004334ca;
                case 6:
                  puVar23 = (uint *)(this->super_DeconvolutionDepthWise).activation_params.data;
                  auVar75 = vbroadcastss_avx512f(ZEXT416(*puVar23));
                  uVar111 = puVar23[1];
                  auVar202._4_4_ = uVar111;
                  auVar202._0_4_ = uVar111;
                  auVar202._8_4_ = uVar111;
                  auVar202._12_4_ = uVar111;
                  auVar202._16_4_ = uVar111;
                  auVar202._20_4_ = uVar111;
                  auVar202._24_4_ = uVar111;
                  auVar202._28_4_ = uVar111;
                  auVar202._32_4_ = uVar111;
                  auVar202._36_4_ = uVar111;
                  auVar202._40_4_ = uVar111;
                  auVar202._44_4_ = uVar111;
                  auVar202._48_4_ = uVar111;
                  auVar202._52_4_ = uVar111;
                  auVar202._56_4_ = uVar111;
                  auVar202._60_4_ = uVar111;
                  auVar202 = vfmadd213ps_avx512f(auVar75,auVar205,auVar202);
                  auVar202 = vmaxps_avx512f(auVar202,auVar247);
                  auVar202 = vminps_avx512f(auVar202,auVar259);
LAB_004334ca:
                  auVar205 = vmulps_avx512f(auVar202,auVar205);
                }
                *pauVar115 = auVar205;
                pauVar115 = pauVar115 + 1;
                iVar110 = iVar110 + 1;
                local_374 = local_374 + 1;
              } while (iVar110 != _w);
            }
            iVar106 = iVar106 + 1;
          } while (iVar106 != _h);
        }
        local_358 = local_358 + 1;
      } while (local_358 != uVar109);
    }
  }
  else {
    uVar17 = (long)(int)(iVar113 * uVar15) / (long)iVar110;
    uVar122 = (long)iVar102 / (long)iVar110;
    local_318 = 1;
    local_328 = 1;
    if (opt->use_packing_layout == true) {
      local_328 = 0x10;
      local_318 = 0x10;
      if ((uVar17 & 0xf) != 0) {
        if ((uVar17 & 7) == 0) {
          local_318 = 8;
        }
        else {
          local_318 = (uint)((uVar17 & 3) == 0) * 3 + 1;
        }
      }
      if ((uVar122 & 0xf) != 0) {
        if ((uVar122 & 7) == 0) {
          local_328 = 8;
        }
        else {
          local_328 = (uint)((uVar122 & 3) == 0) * 3 + 1;
        }
      }
    }
    piVar18 = bottom_blob->refcount;
    local_1b8.data = bottom_blob->data;
    local_1b8.refcount = bottom_blob->refcount;
    local_1b8.elemsize = bottom_blob->elemsize;
    local_1b8.elempack = bottom_blob->elempack;
    local_1b8.allocator = bottom_blob->allocator;
    local_1b8.dims = bottom_blob->dims;
    local_1b8.w = bottom_blob->w;
    local_1b8.h = bottom_blob->h;
    local_1b8.d = bottom_blob->d;
    local_1b8.c = bottom_blob->c;
    local_1b8.cstep = bottom_blob->cstep;
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + 1;
      UNLOCK();
    }
    if (local_318 < iVar113) {
      auVar195 = vmovdqu64_avx512f((undefined1  [64])*opt);
      auVar195 = vmovdqu64_avx512f(auVar195);
      stack0xfffffffffffffdd8 = auVar195._16_48_;
      local_238._0_8_ = auVar195._0_8_;
      local_238._8_8_ = opt->workspace_allocator;
      convert_packing(bottom_blob,&local_1b8,local_318,(Option *)local_238);
      if (local_1b8.data == (void *)0x0) {
        iVar102 = -100;
        bVar27 = false;
      }
      else {
        if ((long)local_1b8.c * local_1b8.cstep != 0) goto LAB_00434736;
        bVar27 = false;
        iVar102 = -100;
      }
    }
    else {
LAB_00434736:
      auVar100 = auStack_21c;
      piVar18 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
      local_238._12_4_ = local_298.refcount._4_4_;
      local_238._8_4_ = local_298.refcount._0_4_;
      local_238._0_8_ = local_298.data;
      local_238._16_8_ = local_298.elemsize;
      iStack_220 = local_298.elempack;
      pAStack_218 = local_298.allocator;
      uStack_210._4_1_ = (bool)(undefined1)local_298.w;
      uStack_210._5_1_ = (bool)local_298.w._1_1_;
      uStack_210._6_1_ = (bool)local_298.w._2_1_;
      uStack_210._7_1_ = (bool)local_298.w._3_1_;
      uStack_210._0_4_ = local_298.dims;
      _iStack_208 = local_298._48_8_;
      auStack_21c._32_4_ = auVar100._32_4_;
      iStack_200._0_1_ = (bool)(undefined1)local_298.c;
      iStack_200._1_1_ = (bool)local_298.c._1_1_;
      iStack_200._2_1_ = (bool)local_298.c._2_1_;
      iStack_200._3_1_ = (bool)local_298.c._3_1_;
      local_1f8 = local_298.cstep;
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + 1;
        UNLOCK();
      }
      if (local_328 < uVar111) {
        Mat::create((Mat *)local_238,_w,_h,
                    (this->super_DeconvolutionDepthWise).num_output / (int)local_328,
                    (ulong)local_328 * (sVar120 / uVar111),local_328,opt->workspace_allocator);
        iVar102 = -100;
        if (((void *)local_238._0_8_ != (void *)0x0) && ((long)iStack_200 * local_1f8 != 0))
        goto LAB_00434831;
LAB_00434b1b:
        bVar27 = false;
      }
      else {
LAB_00434831:
        if (0 < (this->super_DeconvolutionDepthWise).group) {
          iVar106 = 0;
          iVar113 = 0;
          lVar121 = 0;
          do {
            OVar99 = _local_238;
            local_100 = (void *)((long)(iVar106 / local_318) * local_1b8.cstep * local_1b8.elemsize
                                + (long)local_1b8.data);
            local_f8 = (int *)0x0;
            local_f0 = local_1b8.elemsize;
            local_e8 = local_1b8.elempack;
            local_e0 = local_1b8.allocator;
            local_c0 = ((long)local_1b8.d * local_1b8.elemsize *
                        (long)local_1b8.h * (long)local_1b8.w + 0xf & 0xfffffffffffffff0) /
                       local_1b8.elemsize;
            local_d8 = local_1b8.dims;
            iStack_d4 = local_1b8.w;
            iStack_d0 = local_1b8.h;
            iStack_cc = local_1b8.d;
            local_148 = (void *)((long)(iVar113 / (int)local_328) * local_1f8 * local_238._16_8_ +
                                local_238._0_8_);
            local_140 = (int *)0x0;
            local_138 = (Allocator *)local_238._16_8_;
            local_130 = iStack_220;
            local_128 = pAStack_218;
            uVar45 = uStack_210;
            uVar46 = _iStack_208;
            local_108 = ((long)iStack_204 * local_238._16_8_ *
                         (long)iStack_208 * (long)uStack_210._4_4_ + 0xfU & 0xfffffffffffffff0) /
                        (ulong)local_238._16_8_;
            uStack_210._0_4_ = (int)uVar45;
            uStack_210._4_4_ = SUB84(uVar45,4);
            local_120 = (int)uStack_210;
            iStack_11c = uStack_210._4_4_;
            iStack_208 = (int)uVar46;
            iStack_204 = SUB84(uVar46,4);
            iStack_118 = iStack_208;
            iStack_114 = iStack_204;
            pLVar25 = (this->group_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar121];
            auVar195 = vmovdqu64_avx512f((undefined1  [64])*local_1f0);
            auVar195 = vmovdqu64_avx512f(auVar195);
            auStack_68 = auVar195._16_48_;
            local_78 = auVar195._0_8_;
            pAStack_70 = pAStack_218;
            _local_238 = OVar99;
            local_110 = (int)uVar122 / (int)local_328;
            local_c8 = (int)((long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff
                                   ) / (long)local_318);
            iVar102 = (*pLVar25->_vptr_Layer[7])(pLVar25,&local_100,&local_148,&local_78);
            if (local_140 != (int *)0x0) {
              LOCK();
              *local_140 = *local_140 + -1;
              UNLOCK();
              if (*local_140 == 0) {
                if (local_128 == (Allocator *)0x0) {
                  if (local_148 != (void *)0x0) {
                    free(local_148);
                  }
                }
                else {
                  (*local_128->_vptr_Allocator[3])();
                }
              }
            }
            if (local_f8 != (int *)0x0) {
              LOCK();
              *local_f8 = *local_f8 + -1;
              UNLOCK();
              if (*local_f8 == 0) {
                if (local_e0 == (Allocator *)0x0) {
                  if (local_100 != (void *)0x0) {
                    free(local_100);
                  }
                }
                else {
                  (*local_e0->_vptr_Allocator[3])();
                }
              }
            }
            if (iVar102 != 0) goto LAB_00434b1b;
            lVar121 = lVar121 + 1;
            iVar113 = iVar113 + (int)uVar122;
            iVar106 = iVar106 + (int)uVar17;
          } while (lVar121 < (this->super_DeconvolutionDepthWise).group);
        }
        if (local_328 < uVar111) {
          convert_packing((Mat *)local_238,&local_298,uVar111,local_1f0);
          iVar102 = -100;
          if ((local_298.data == (void *)0x0) || ((long)local_298.c * local_298.cstep == 0))
          goto LAB_00434b1b;
        }
        else {
          if ((Allocator *)local_238._8_8_ != (Allocator *)0x0) {
            LOCK();
            *(int *)(_func_int ***)local_238._8_8_ = *(int *)(_func_int ***)local_238._8_8_ + 1;
            UNLOCK();
          }
          piVar18 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
          if (piVar18 != (int *)0x0) {
            LOCK();
            *piVar18 = *piVar18 + -1;
            UNLOCK();
            if (*piVar18 == 0) {
              if (local_298.allocator == (Allocator *)0x0) {
                if (local_298.data != (void *)0x0) {
                  free(local_298.data);
                }
              }
              else {
                (*(local_298.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          OVar99 = _local_238;
          local_298.data = (void *)local_238._0_8_;
          local_298.refcount._0_4_ = local_238._8_4_;
          local_298.refcount._4_4_ = local_238._12_4_;
          local_298.elemsize = local_238._16_8_;
          local_298.elempack = iStack_220;
          local_298.allocator = pAStack_218;
          local_298.dims = local_238._40_4_;
          local_298.w = local_238._44_4_;
          local_298.h = iStack_208;
          local_298.d = iStack_204;
          iStack_200 = OVar99._56_4_;
          local_298.c = iStack_200;
          local_298.cstep = local_1f8;
          _local_238 = OVar99;
        }
        iVar102 = -100;
        bVar27 = true;
      }
      if ((Allocator *)local_238._8_8_ != (Allocator *)0x0) {
        LOCK();
        *(int *)(_func_int ***)local_238._8_8_ = *(int *)(_func_int ***)local_238._8_8_ + -1;
        UNLOCK();
        if (*(int *)(_func_int ***)local_238._8_8_ == 0) {
          if (pAStack_218 == (Allocator *)0x0) {
            if ((void *)local_238._0_8_ != (void *)0x0) {
              free((void *)local_238._0_8_);
            }
          }
          else {
            (*pAStack_218->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (local_1b8.refcount != (int *)0x0) {
      LOCK();
      *local_1b8.refcount = *local_1b8.refcount + -1;
      UNLOCK();
      if (*local_1b8.refcount == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (!bVar27) goto LAB_00434cc9;
  }
  pMVar101 = local_1c0;
  DeconvolutionDepthWise::cut_padding
            (&this->super_DeconvolutionDepthWise,&local_298,local_1c0,local_1f0);
  if ((pMVar101->data == (void *)0x0) || (iVar102 = 0, (long)local_1c0->c * local_1c0->cstep == 0))
  {
    iVar102 = -100;
  }
LAB_00434cc9:
  piVar18 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_298.allocator == (Allocator *)0x0) {
        if (local_298.data != (void *)0x0) {
          free(local_298.data);
        }
      }
      else {
        (*(local_298.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar102;
}

Assistant:

int DeconvolutionDepthWise_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            int ret = op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
            if (ret != 0)
                return ret;
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
            if (top_blob_bordered.empty())
                return -100;
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}